

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersector1<4>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  Primitive PVar9;
  int iVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  uint uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  byte bVar71;
  byte bVar72;
  ulong uVar73;
  uint uVar74;
  uint uVar75;
  uint uVar76;
  long lVar77;
  ulong uVar78;
  uint uVar79;
  ulong uVar80;
  byte bVar81;
  float fVar82;
  float fVar83;
  float fVar130;
  float fVar132;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar91 [16];
  float fVar131;
  float fVar133;
  float fVar135;
  float fVar136;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar134;
  float fVar137;
  float fVar138;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined4 uVar139;
  vint4 bi_2;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined8 uVar149;
  vint4 bi_1;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  vint4 bi;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar163;
  float fVar174;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  float fVar175;
  float fVar182;
  float fVar183;
  vint4 ai_2;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar184;
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  vint4 ai;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  vint4 ai_1;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [16];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_624;
  Precalculations *local_620;
  RayQueryContext *local_618;
  Primitive *local_610;
  ulong local_608;
  undefined1 local_600 [16];
  ulong local_5e8;
  undefined1 local_5e0 [32];
  RTCFilterFunctionNArguments local_5b0;
  undefined1 local_580 [32];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  undefined8 local_530;
  undefined4 local_528;
  float local_524;
  undefined4 local_520;
  undefined4 local_51c;
  undefined4 local_518;
  uint local_514;
  uint local_510;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  Geometry *local_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float local_410;
  undefined4 uStack_40c;
  undefined8 uStack_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined4 local_300;
  int local_2fc;
  undefined1 local_2f0 [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  byte local_2b0;
  float local_2a0 [4];
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar195 [64];
  
  PVar9 = prim[1];
  uVar78 = (ulong)(byte)PVar9;
  fVar163 = *(float *)(prim + uVar78 * 0x19 + 0x12);
  auVar88 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar78 * 0x19 + 6));
  auVar164._0_4_ = fVar163 * auVar88._0_4_;
  auVar164._4_4_ = fVar163 * auVar88._4_4_;
  auVar164._8_4_ = fVar163 * auVar88._8_4_;
  auVar164._12_4_ = fVar163 * auVar88._12_4_;
  auVar91._0_4_ = fVar163 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar91._4_4_ = fVar163 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar91._8_4_ = fVar163 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar91._12_4_ = fVar163 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 4 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 5 + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar213 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xb + 6)));
  auVar213 = vcvtdq2ps_avx(auVar213);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar78 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  uVar80 = (ulong)(uint)((int)(uVar78 * 9) * 2);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + uVar78 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  uVar73 = (ulong)(uint)((int)(uVar78 * 5) << 2);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar205._4_4_ = auVar91._0_4_;
  auVar205._0_4_ = auVar91._0_4_;
  auVar205._8_4_ = auVar91._0_4_;
  auVar205._12_4_ = auVar91._0_4_;
  auVar24 = vshufps_avx(auVar91,auVar91,0x55);
  auVar87 = vshufps_avx(auVar91,auVar91,0xaa);
  fVar163 = auVar87._0_4_;
  auVar152._0_4_ = fVar163 * auVar213._0_4_;
  fVar175 = auVar87._4_4_;
  auVar152._4_4_ = fVar175 * auVar213._4_4_;
  fVar182 = auVar87._8_4_;
  auVar152._8_4_ = fVar182 * auVar213._8_4_;
  fVar183 = auVar87._12_4_;
  auVar152._12_4_ = fVar183 * auVar213._12_4_;
  auVar150._0_4_ = auVar21._0_4_ * fVar163;
  auVar150._4_4_ = auVar21._4_4_ * fVar175;
  auVar150._8_4_ = auVar21._8_4_ * fVar182;
  auVar150._12_4_ = auVar21._12_4_ * fVar183;
  auVar140._0_4_ = auVar90._0_4_ * fVar163;
  auVar140._4_4_ = auVar90._4_4_ * fVar175;
  auVar140._8_4_ = auVar90._8_4_ * fVar182;
  auVar140._12_4_ = auVar90._12_4_ * fVar183;
  auVar87 = vfmadd231ps_fma(auVar152,auVar24,auVar86);
  auVar85 = vfmadd231ps_fma(auVar150,auVar24,auVar89);
  auVar24 = vfmadd231ps_fma(auVar140,auVar23,auVar24);
  auVar84 = vfmadd231ps_fma(auVar87,auVar205,auVar88);
  auVar85 = vfmadd231ps_fma(auVar85,auVar205,auVar20);
  auVar91 = vfmadd231ps_fma(auVar24,auVar22,auVar205);
  auVar206._4_4_ = auVar164._0_4_;
  auVar206._0_4_ = auVar164._0_4_;
  auVar206._8_4_ = auVar164._0_4_;
  auVar206._12_4_ = auVar164._0_4_;
  auVar24 = vshufps_avx(auVar164,auVar164,0x55);
  auVar87 = vshufps_avx(auVar164,auVar164,0xaa);
  fVar163 = auVar87._0_4_;
  auVar207._0_4_ = fVar163 * auVar213._0_4_;
  fVar175 = auVar87._4_4_;
  auVar207._4_4_ = fVar175 * auVar213._4_4_;
  fVar182 = auVar87._8_4_;
  auVar207._8_4_ = fVar182 * auVar213._8_4_;
  fVar183 = auVar87._12_4_;
  auVar207._12_4_ = fVar183 * auVar213._12_4_;
  auVar176._0_4_ = auVar21._0_4_ * fVar163;
  auVar176._4_4_ = auVar21._4_4_ * fVar175;
  auVar176._8_4_ = auVar21._8_4_ * fVar182;
  auVar176._12_4_ = auVar21._12_4_ * fVar183;
  auVar165._0_4_ = auVar90._0_4_ * fVar163;
  auVar165._4_4_ = auVar90._4_4_ * fVar175;
  auVar165._8_4_ = auVar90._8_4_ * fVar182;
  auVar165._12_4_ = auVar90._12_4_ * fVar183;
  auVar86 = vfmadd231ps_fma(auVar207,auVar24,auVar86);
  auVar213 = vfmadd231ps_fma(auVar176,auVar24,auVar89);
  auVar89 = vfmadd231ps_fma(auVar165,auVar24,auVar23);
  auVar21 = vfmadd231ps_fma(auVar86,auVar206,auVar88);
  auVar23 = vfmadd231ps_fma(auVar213,auVar206,auVar20);
  auVar196._8_4_ = 0x7fffffff;
  auVar196._0_8_ = 0x7fffffff7fffffff;
  auVar196._12_4_ = 0x7fffffff;
  auVar90 = vfmadd231ps_fma(auVar89,auVar206,auVar22);
  auVar88 = vandps_avx(auVar84,auVar196);
  auVar192._8_4_ = 0x219392ef;
  auVar192._0_8_ = 0x219392ef219392ef;
  auVar192._12_4_ = 0x219392ef;
  uVar80 = vcmpps_avx512vl(auVar88,auVar192,1);
  bVar13 = (bool)((byte)uVar80 & 1);
  auVar87._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar84._0_4_;
  bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar84._4_4_;
  bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar84._8_4_;
  bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar84._12_4_;
  auVar88 = vandps_avx(auVar85,auVar196);
  uVar80 = vcmpps_avx512vl(auVar88,auVar192,1);
  bVar13 = (bool)((byte)uVar80 & 1);
  auVar84._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar85._0_4_;
  bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar85._4_4_;
  bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar85._8_4_;
  bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar85._12_4_;
  auVar88 = vandps_avx(auVar91,auVar196);
  uVar80 = vcmpps_avx512vl(auVar88,auVar192,1);
  bVar13 = (bool)((byte)uVar80 & 1);
  auVar85._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._0_4_;
  bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._4_4_;
  bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._8_4_;
  bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._12_4_;
  auVar86 = vrcp14ps_avx512vl(auVar87);
  auVar193._8_4_ = 0x3f800000;
  auVar193._0_8_ = &DAT_3f8000003f800000;
  auVar193._12_4_ = 0x3f800000;
  auVar88 = vfnmadd213ps_fma(auVar87,auVar86,auVar193);
  auVar20 = vfmadd132ps_fma(auVar88,auVar86,auVar86);
  auVar86 = vrcp14ps_avx512vl(auVar84);
  auVar88 = vfnmadd213ps_fma(auVar84,auVar86,auVar193);
  auVar89 = vfmadd132ps_fma(auVar88,auVar86,auVar86);
  auVar86 = vrcp14ps_avx512vl(auVar85);
  auVar88 = vfnmadd213ps_fma(auVar85,auVar86,auVar193);
  auVar22 = vfmadd132ps_fma(auVar88,auVar86,auVar86);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar78 * 7 + 6);
  auVar88 = vpmovsxwd_avx(auVar88);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar21);
  auVar185._0_4_ = auVar20._0_4_ * auVar88._0_4_;
  auVar185._4_4_ = auVar20._4_4_ * auVar88._4_4_;
  auVar185._8_4_ = auVar20._8_4_ * auVar88._8_4_;
  auVar185._12_4_ = auVar20._12_4_ * auVar88._12_4_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar78 * 9 + 6);
  auVar88 = vpmovsxwd_avx(auVar86);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar21);
  auVar87 = vpbroadcastd_avx512vl();
  auVar213._8_8_ = 0;
  auVar213._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar86 = vpmovsxwd_avx(auVar213);
  auVar153._0_4_ = auVar20._0_4_ * auVar88._0_4_;
  auVar153._4_4_ = auVar20._4_4_ * auVar88._4_4_;
  auVar153._8_4_ = auVar20._8_4_ * auVar88._8_4_;
  auVar153._12_4_ = auVar20._12_4_ * auVar88._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar78 * -2 + 6);
  auVar88 = vpmovsxwd_avx(auVar20);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar23);
  auVar194._0_4_ = auVar89._0_4_ * auVar88._0_4_;
  auVar194._4_4_ = auVar89._4_4_ * auVar88._4_4_;
  auVar194._8_4_ = auVar89._8_4_ * auVar88._8_4_;
  auVar194._12_4_ = auVar89._12_4_ * auVar88._12_4_;
  auVar195 = ZEXT1664(auVar194);
  auVar88 = vcvtdq2ps_avx(auVar86);
  auVar88 = vsubps_avx(auVar88,auVar23);
  auVar151._0_4_ = auVar89._0_4_ * auVar88._0_4_;
  auVar151._4_4_ = auVar89._4_4_ * auVar88._4_4_;
  auVar151._8_4_ = auVar89._8_4_ * auVar88._8_4_;
  auVar151._12_4_ = auVar89._12_4_ * auVar88._12_4_;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar73 + uVar78 + 6);
  auVar88 = vpmovsxwd_avx(auVar89);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar90);
  auVar177._0_4_ = auVar22._0_4_ * auVar88._0_4_;
  auVar177._4_4_ = auVar22._4_4_ * auVar88._4_4_;
  auVar177._8_4_ = auVar22._8_4_ * auVar88._8_4_;
  auVar177._12_4_ = auVar22._12_4_ * auVar88._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar78 * 0x17 + 6);
  auVar88 = vpmovsxwd_avx(auVar21);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar90);
  auVar141._0_4_ = auVar22._0_4_ * auVar88._0_4_;
  auVar141._4_4_ = auVar22._4_4_ * auVar88._4_4_;
  auVar141._8_4_ = auVar22._8_4_ * auVar88._8_4_;
  auVar141._12_4_ = auVar22._12_4_ * auVar88._12_4_;
  auVar88 = vpminsd_avx(auVar185,auVar153);
  auVar86 = vpminsd_avx(auVar194,auVar151);
  auVar88 = vmaxps_avx(auVar88,auVar86);
  auVar86 = vpminsd_avx(auVar177,auVar141);
  uVar139 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar22._4_4_ = uVar139;
  auVar22._0_4_ = uVar139;
  auVar22._8_4_ = uVar139;
  auVar22._12_4_ = uVar139;
  auVar86 = vmaxps_avx512vl(auVar86,auVar22);
  auVar88 = vmaxps_avx(auVar88,auVar86);
  auVar23._8_4_ = 0x3f7ffffa;
  auVar23._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar23._12_4_ = 0x3f7ffffa;
  local_1d0 = vmulps_avx512vl(auVar88,auVar23);
  auVar173 = ZEXT1664(local_1d0);
  auVar88 = vpmaxsd_avx(auVar185,auVar153);
  auVar86 = vpmaxsd_avx(auVar194,auVar151);
  auVar88 = vminps_avx(auVar88,auVar86);
  auVar86 = vpmaxsd_avx(auVar177,auVar141);
  fVar163 = (ray->super_RayK<1>).tfar;
  auVar90._4_4_ = fVar163;
  auVar90._0_4_ = fVar163;
  auVar90._8_4_ = fVar163;
  auVar90._12_4_ = fVar163;
  auVar86 = vminps_avx512vl(auVar86,auVar90);
  auVar88 = vminps_avx(auVar88,auVar86);
  auVar24._8_4_ = 0x3f800003;
  auVar24._0_8_ = 0x3f8000033f800003;
  auVar24._12_4_ = 0x3f800003;
  auVar88 = vmulps_avx512vl(auVar88,auVar24);
  uVar149 = vcmpps_avx512vl(local_1d0,auVar88,2);
  uVar80 = vpcmpgtd_avx512vl(auVar87,_DAT_01ff0cf0);
  uVar80 = ((byte)uVar149 & 0xf) & uVar80;
  if ((char)uVar80 != '\0') {
    do {
      local_580 = auVar195._0_32_;
      local_5e0 = auVar173._0_32_;
      local_460 = in_ZMM21._0_32_;
      local_440 = in_ZMM20._0_32_;
      lVar27 = 0;
      for (uVar73 = uVar80; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar79 = *(uint *)(prim + 2);
      uVar76 = *(uint *)(prim + lVar27 * 4 + 6);
      local_608 = (ulong)uVar79;
      pGVar11 = (context->scene->geometries).items[uVar79].ptr;
      local_5e8 = (ulong)uVar76;
      uVar73 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                               pGVar11[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar76);
      p_Var12 = pGVar11[1].intersectionFilterN;
      lVar27 = *(long *)&pGVar11[1].time_range.upper;
      local_600 = *(undefined1 (*) [16])(lVar27 + (long)p_Var12 * uVar73);
      pauVar3 = (undefined1 (*) [16])(lVar27 + (uVar73 + 1) * (long)p_Var12);
      local_550 = *(undefined8 *)*pauVar3;
      uStack_548 = *(undefined8 *)(*pauVar3 + 8);
      auVar88 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar27 + (uVar73 + 2) * (long)p_Var12);
      local_560 = *(undefined8 *)*pauVar4;
      uStack_558 = *(undefined8 *)(*pauVar4 + 8);
      auVar86 = *pauVar4;
      uVar80 = uVar80 - 1 & uVar80;
      pauVar5 = (undefined1 (*) [12])(lVar27 + (uVar73 + 3) * (long)p_Var12);
      local_2c0 = *(undefined8 *)*pauVar5;
      uStack_2b8 = *(undefined8 *)(*pauVar5 + 8);
      local_540 = (float)local_2c0;
      fStack_53c = (float)((ulong)local_2c0 >> 0x20);
      fStack_538 = (float)uStack_2b8;
      fStack_534 = (float)((ulong)uStack_2b8 >> 0x20);
      if (uVar80 != 0) {
        uVar78 = uVar80 - 1 & uVar80;
        for (uVar73 = uVar80; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        }
        if (uVar78 != 0) {
          for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar10 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar6 = (ray->super_RayK<1>).org.field_0;
      auVar20 = vsubps_avx(local_600,(undefined1  [16])aVar6);
      uVar139 = auVar20._0_4_;
      auVar154._4_4_ = uVar139;
      auVar154._0_4_ = uVar139;
      auVar154._8_4_ = uVar139;
      auVar154._12_4_ = uVar139;
      auVar213 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      aVar7 = (pre->ray_space).vx.field_0;
      aVar8 = (pre->ray_space).vy.field_0;
      fVar163 = (pre->ray_space).vz.field_0.m128[0];
      fVar175 = (pre->ray_space).vz.field_0.m128[1];
      fVar182 = (pre->ray_space).vz.field_0.m128[2];
      fVar183 = (pre->ray_space).vz.field_0.m128[3];
      auVar200._0_4_ = auVar20._0_4_ * fVar163;
      auVar200._4_4_ = auVar20._4_4_ * fVar175;
      auVar200._8_4_ = auVar20._8_4_ * fVar182;
      auVar200._12_4_ = auVar20._12_4_ * fVar183;
      auVar213 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar8,auVar213);
      auVar21 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar7,auVar154);
      auVar213 = vshufps_avx(local_600,local_600,0xff);
      auVar89 = vsubps_avx(auVar88,(undefined1  [16])aVar6);
      uVar139 = auVar89._0_4_;
      auVar166._4_4_ = uVar139;
      auVar166._0_4_ = uVar139;
      auVar166._8_4_ = uVar139;
      auVar166._12_4_ = uVar139;
      auVar20 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar201._0_4_ = auVar89._0_4_ * fVar163;
      auVar201._4_4_ = auVar89._4_4_ * fVar175;
      auVar201._8_4_ = auVar89._8_4_ * fVar182;
      auVar201._12_4_ = auVar89._12_4_ * fVar183;
      auVar20 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar8,auVar20);
      auVar22 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar7,auVar166);
      auVar88 = vshufps_avx(auVar88,auVar88,0xff);
      auVar89 = vsubps_avx(auVar86,(undefined1  [16])aVar6);
      uVar139 = auVar89._0_4_;
      auVar197._4_4_ = uVar139;
      auVar197._0_4_ = uVar139;
      auVar197._8_4_ = uVar139;
      auVar197._12_4_ = uVar139;
      auVar20 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar203._0_4_ = auVar89._0_4_ * fVar163;
      auVar203._4_4_ = auVar89._4_4_ * fVar175;
      auVar203._8_4_ = auVar89._8_4_ * fVar182;
      auVar203._12_4_ = auVar89._12_4_ * fVar183;
      auVar20 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar8,auVar20);
      auVar23 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar7,auVar197);
      auVar86 = vshufps_avx(auVar86,auVar86,0xff);
      auVar65._12_4_ = fStack_534;
      auVar65._0_12_ = *pauVar5;
      auVar89 = vsubps_avx512vl(auVar65,(undefined1  [16])aVar6);
      uVar139 = auVar89._0_4_;
      auVar167._4_4_ = uVar139;
      auVar167._0_4_ = uVar139;
      auVar167._8_4_ = uVar139;
      auVar167._12_4_ = uVar139;
      auVar20 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar204._0_4_ = auVar89._0_4_ * fVar163;
      auVar204._4_4_ = auVar89._4_4_ * fVar175;
      auVar204._8_4_ = auVar89._8_4_ * fVar182;
      auVar204._12_4_ = auVar89._12_4_ * fVar183;
      auVar20 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar8,auVar20);
      auVar20 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar7,auVar167);
      lVar27 = (long)iVar10 * 0x44;
      auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar27);
      auVar89 = vshufps_avx512vl(auVar65,auVar65,0xff);
      local_3c0 = vbroadcastss_avx512vl(auVar21);
      auVar92._8_4_ = 1;
      auVar92._0_8_ = 0x100000001;
      auVar92._12_4_ = 1;
      auVar92._16_4_ = 1;
      auVar92._20_4_ = 1;
      auVar92._24_4_ = 1;
      auVar92._28_4_ = 1;
      local_4e0 = vpermps_avx512vl(auVar92,ZEXT1632(auVar21));
      uVar149 = auVar213._0_8_;
      local_80._8_8_ = uVar149;
      local_80._0_8_ = uVar149;
      local_80._16_8_ = uVar149;
      local_80._24_8_ = uVar149;
      auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x484);
      uVar139 = auVar22._0_4_;
      local_500._4_4_ = uVar139;
      local_500._0_4_ = uVar139;
      local_500._8_4_ = uVar139;
      local_500._12_4_ = uVar139;
      local_500._16_4_ = uVar139;
      local_500._20_4_ = uVar139;
      local_500._24_4_ = uVar139;
      local_500._28_4_ = uVar139;
      local_1c0 = vpermps_avx512vl(auVar92,ZEXT1632(auVar22));
      uVar149 = auVar88._0_8_;
      local_a0._8_8_ = uVar149;
      local_a0._0_8_ = uVar149;
      local_a0._16_8_ = uVar149;
      local_a0._24_8_ = uVar149;
      auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x908);
      local_c0 = vbroadcastss_avx512vl(auVar23);
      local_e0 = vpermps_avx512vl(auVar92,ZEXT1632(auVar23));
      local_100 = vbroadcastsd_avx512vl(auVar86);
      auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0xd8c);
      local_480 = vbroadcastss_avx512vl(auVar20);
      auVar216 = ZEXT3264(local_480);
      local_4a0 = vpermps_avx512vl(auVar92,ZEXT1632(auVar20));
      auVar217 = ZEXT3264(local_4a0);
      _local_120 = vbroadcastsd_avx512vl(auVar89);
      auVar92 = vmulps_avx512vl(local_480,auVar106);
      auVar93 = vmulps_avx512vl(local_4a0,auVar106);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar107,local_c0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar107,local_e0);
      auVar88 = vfmadd231ps_fma(auVar92,auVar109,local_500);
      auVar94 = vfmadd231ps_avx512vl(auVar93,auVar109,local_1c0);
      auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar108,local_3c0);
      auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar27);
      auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x484);
      auVar96 = vfmadd231ps_avx512vl(auVar94,auVar108,local_4e0);
      auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x908);
      auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0xd8c);
      auVar97 = vmulps_avx512vl(local_480,auVar105);
      auVar98 = vmulps_avx512vl(local_4a0,auVar105);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,local_c0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_e0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_500);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_1c0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar92,local_3c0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar92,local_4e0);
      auVar99 = vsubps_avx512vl(auVar97,auVar95);
      auVar100 = vsubps_avx512vl(auVar98,auVar96);
      auVar101 = vmulps_avx512vl(auVar96,auVar99);
      auVar102 = vmulps_avx512vl(auVar95,auVar100);
      auVar101 = vsubps_avx512vl(auVar101,auVar102);
      auVar102 = vmulps_avx512vl(_local_120,auVar106);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,local_100);
      auVar88 = vfmadd231ps_fma(auVar102,auVar109,local_a0);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar108,local_80);
      auVar103 = vmulps_avx512vl(_local_120,auVar105);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar94,local_100);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar93,local_a0);
      auVar213 = vfmadd231ps_fma(auVar103,auVar92,local_80);
      auVar103 = vmulps_avx512vl(auVar100,auVar100);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar99,auVar99);
      auVar104 = vmaxps_avx512vl(auVar102,ZEXT1632(auVar213));
      auVar104 = vmulps_avx512vl(auVar104,auVar104);
      auVar103 = vmulps_avx512vl(auVar104,auVar103);
      auVar101 = vmulps_avx512vl(auVar101,auVar101);
      uVar149 = vcmpps_avx512vl(auVar101,auVar103,2);
      auVar88 = vblendps_avx(auVar21,local_600,8);
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar86 = vandps_avx512vl(auVar88,auVar89);
      auVar88 = vblendps_avx(auVar22,*pauVar3,8);
      auVar88 = vandps_avx512vl(auVar88,auVar89);
      auVar86 = vmaxps_avx(auVar86,auVar88);
      auVar88 = vblendps_avx(auVar23,*pauVar4,8);
      auVar90 = vandps_avx512vl(auVar88,auVar89);
      auVar88 = vblendps_avx(auVar20,auVar65,8);
      auVar88 = vandps_avx512vl(auVar88,auVar89);
      auVar88 = vmaxps_avx(auVar90,auVar88);
      auVar88 = vmaxps_avx(auVar86,auVar88);
      auVar86 = vmovshdup_avx(auVar88);
      auVar86 = vmaxss_avx(auVar86,auVar88);
      auVar88 = vshufpd_avx(auVar88,auVar88,1);
      auVar88 = vmaxss_avx(auVar88,auVar86);
      local_380._0_4_ = (undefined4)iVar10;
      register0x00001504 = auVar21._4_12_;
      auVar103._4_4_ = local_380._0_4_;
      auVar103._0_4_ = local_380._0_4_;
      auVar103._8_4_ = local_380._0_4_;
      auVar103._12_4_ = local_380._0_4_;
      auVar103._16_4_ = local_380._0_4_;
      auVar103._20_4_ = local_380._0_4_;
      auVar103._24_4_ = local_380._0_4_;
      auVar103._28_4_ = local_380._0_4_;
      uVar25 = vcmpps_avx512vl(auVar103,_DAT_02020f40,0xe);
      bVar81 = (byte)uVar149 & (byte)uVar25;
      auVar88 = vmulss_avx512f(auVar88,ZEXT416(0x35000000));
      auVar101._8_4_ = 2;
      auVar101._0_8_ = 0x200000002;
      auVar101._12_4_ = 2;
      auVar101._16_4_ = 2;
      auVar101._20_4_ = 2;
      auVar101._24_4_ = 2;
      auVar101._28_4_ = 2;
      local_140 = vpermps_avx512vl(auVar101,ZEXT1632(auVar21));
      local_160 = vpermps_avx512vl(auVar101,ZEXT1632(auVar22));
      local_180 = vpermps_avx512vl(auVar101,ZEXT1632(auVar23));
      local_1a0 = vpermps_avx2(auVar101,ZEXT1632(auVar20));
      uVar75 = *(uint *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      auVar86 = auVar100._0_16_;
      if (bVar81 == 0) {
        auVar86 = vxorps_avx512vl(auVar86,auVar86);
        auVar214 = ZEXT1664(auVar86);
        auVar195 = ZEXT3264(local_580);
        in_ZMM20 = ZEXT3264(local_440);
        auVar173 = ZEXT3264(local_5e0);
        in_ZMM21 = ZEXT3264(local_460);
        auVar212 = ZEXT3264(local_3c0);
        auVar210 = ZEXT3264(local_4e0);
        auVar211 = ZEXT3264(local_500);
      }
      else {
        local_400._0_16_ = ZEXT416(uVar75);
        local_3e0._0_16_ = auVar88;
        auVar105 = vmulps_avx512vl(local_1a0,auVar105);
        auVar94 = vfmadd213ps_avx512vl(auVar94,local_180,auVar105);
        auVar93 = vfmadd213ps_avx512vl(auVar93,local_160,auVar94);
        auVar105 = vfmadd213ps_avx512vl(auVar92,local_140,auVar93);
        auVar106 = vmulps_avx512vl(local_1a0,auVar106);
        auVar107 = vfmadd213ps_avx512vl(auVar107,local_180,auVar106);
        auVar93 = vfmadd213ps_avx512vl(auVar109,local_160,auVar107);
        auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1210);
        auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1694);
        auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1b18);
        auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1f9c);
        auVar101 = vfmadd213ps_avx512vl(auVar108,local_140,auVar93);
        auVar108 = vmulps_avx512vl(local_480,auVar92);
        auVar93 = vmulps_avx512vl(local_4a0,auVar92);
        auVar92 = vmulps_avx512vl(local_1a0,auVar92);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,local_c0);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar106,local_e0);
        auVar106 = vfmadd231ps_avx512vl(auVar92,local_180,auVar106);
        auVar211 = ZEXT3264(local_500);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar107,local_500);
        auVar92 = vfmadd231ps_avx512vl(auVar93,auVar107,local_1c0);
        auVar93 = vfmadd231ps_avx512vl(auVar106,local_160,auVar107);
        auVar94 = vfmadd231ps_avx512vl(auVar108,auVar109,local_3c0);
        auVar210 = ZEXT3264(local_4e0);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar109,local_4e0);
        auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1210);
        auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1b18);
        auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1f9c);
        auVar93 = vfmadd231ps_avx512vl(auVar93,local_140,auVar109);
        auVar109 = vmulps_avx512vl(local_480,auVar106);
        auVar103 = vmulps_avx512vl(local_4a0,auVar106);
        auVar106 = vmulps_avx512vl(local_1a0,auVar106);
        auVar215 = ZEXT1664(auVar88);
        auVar104 = vfmadd231ps_avx512vl(auVar109,auVar107,local_c0);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,local_e0);
        auVar107 = vfmadd231ps_avx512vl(auVar106,local_180,auVar107);
        auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1694);
        auVar106 = vfmadd231ps_avx512vl(auVar104,auVar109,local_500);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,local_1c0);
        auVar109 = vfmadd231ps_avx512vl(auVar107,local_160,auVar109);
        auVar107 = vfmadd231ps_avx512vl(auVar106,auVar108,local_3c0);
        auVar106 = vfmadd231ps_avx512vl(auVar103,auVar108,local_4e0);
        auVar103 = vfmadd231ps_avx512vl(auVar109,local_140,auVar108);
        auVar208._8_4_ = 0x7fffffff;
        auVar208._0_8_ = 0x7fffffff7fffffff;
        auVar208._12_4_ = 0x7fffffff;
        auVar208._16_4_ = 0x7fffffff;
        auVar208._20_4_ = 0x7fffffff;
        auVar208._24_4_ = 0x7fffffff;
        auVar208._28_4_ = 0x7fffffff;
        auVar108 = vandps_avx(auVar94,auVar208);
        auVar109 = vandps_avx(auVar92,auVar208);
        auVar109 = vmaxps_avx(auVar108,auVar109);
        auVar108 = vandps_avx(auVar93,auVar208);
        auVar108 = vmaxps_avx(auVar109,auVar108);
        auVar93 = vbroadcastss_avx512vl(auVar88);
        uVar73 = vcmpps_avx512vl(auVar108,auVar93,1);
        bVar13 = (bool)((byte)uVar73 & 1);
        auVar104._0_4_ = (float)((uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar94._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar94._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar94._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar94._12_4_);
        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar13 * auVar99._16_4_ | (uint)!bVar13 * auVar94._16_4_);
        bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar13 * auVar99._20_4_ | (uint)!bVar13 * auVar94._20_4_);
        bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar13 * auVar99._24_4_ | (uint)!bVar13 * auVar94._24_4_);
        bVar13 = SUB81(uVar73 >> 7,0);
        auVar104._28_4_ = (uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar94._28_4_;
        bVar13 = (bool)((byte)uVar73 & 1);
        auVar110._0_4_ = (float)((uint)bVar13 * auVar100._0_4_ | (uint)!bVar13 * auVar92._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar92._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar92._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar92._12_4_);
        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * auVar92._16_4_);
        bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * auVar92._20_4_);
        bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * auVar92._24_4_);
        bVar13 = SUB81(uVar73 >> 7,0);
        auVar110._28_4_ = (uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar92._28_4_;
        auVar108 = vandps_avx(auVar208,auVar107);
        auVar109 = vandps_avx(auVar106,auVar208);
        auVar109 = vmaxps_avx(auVar108,auVar109);
        auVar108 = vandps_avx(auVar103,auVar208);
        auVar108 = vmaxps_avx(auVar109,auVar108);
        uVar73 = vcmpps_avx512vl(auVar108,auVar93,1);
        bVar13 = (bool)((byte)uVar73 & 1);
        auVar111._0_4_ = (float)((uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar107._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar107._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar107._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar107._12_4_);
        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar13 * auVar99._16_4_ | (uint)!bVar13 * auVar107._16_4_);
        bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar13 * auVar99._20_4_ | (uint)!bVar13 * auVar107._20_4_);
        bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar13 * auVar99._24_4_ | (uint)!bVar13 * auVar107._24_4_);
        bVar13 = SUB81(uVar73 >> 7,0);
        auVar111._28_4_ = (uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar107._28_4_;
        bVar13 = (bool)((byte)uVar73 & 1);
        auVar99._0_4_ = (float)((uint)bVar13 * auVar100._0_4_ | (uint)!bVar13 * auVar106._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar99._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar106._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar99._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar106._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar99._12_4_ = (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar106._12_4_);
        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar99._16_4_ = (float)((uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * auVar106._16_4_);
        bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar99._20_4_ = (float)((uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * auVar106._20_4_);
        bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar99._24_4_ = (float)((uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * auVar106._24_4_);
        bVar13 = SUB81(uVar73 >> 7,0);
        auVar99._28_4_ = (uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar106._28_4_;
        auVar91 = vxorps_avx512vl(auVar86,auVar86);
        auVar214 = ZEXT1664(auVar91);
        auVar108 = vfmadd213ps_avx512vl(auVar104,auVar104,ZEXT1632(auVar91));
        auVar86 = vfmadd231ps_fma(auVar108,auVar110,auVar110);
        auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
        fVar163 = auVar107._0_4_;
        fVar175 = auVar107._4_4_;
        fVar182 = auVar107._8_4_;
        fVar183 = auVar107._12_4_;
        fVar184 = auVar107._16_4_;
        fVar174 = auVar107._20_4_;
        fVar82 = auVar107._24_4_;
        auVar108._4_4_ = fVar175 * fVar175 * fVar175 * auVar86._4_4_ * -0.5;
        auVar108._0_4_ = fVar163 * fVar163 * fVar163 * auVar86._0_4_ * -0.5;
        auVar108._8_4_ = fVar182 * fVar182 * fVar182 * auVar86._8_4_ * -0.5;
        auVar108._12_4_ = fVar183 * fVar183 * fVar183 * auVar86._12_4_ * -0.5;
        auVar108._16_4_ = fVar184 * fVar184 * fVar184 * -0.0;
        auVar108._20_4_ = fVar174 * fVar174 * fVar174 * -0.0;
        auVar108._24_4_ = fVar82 * fVar82 * fVar82 * -0.0;
        auVar108._28_4_ = 0;
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar92,auVar107);
        auVar109._4_4_ = auVar110._4_4_ * auVar108._4_4_;
        auVar109._0_4_ = auVar110._0_4_ * auVar108._0_4_;
        auVar109._8_4_ = auVar110._8_4_ * auVar108._8_4_;
        auVar109._12_4_ = auVar110._12_4_ * auVar108._12_4_;
        auVar109._16_4_ = auVar110._16_4_ * auVar108._16_4_;
        auVar109._20_4_ = auVar110._20_4_ * auVar108._20_4_;
        auVar109._24_4_ = auVar110._24_4_ * auVar108._24_4_;
        auVar109._28_4_ = auVar107._28_4_;
        auVar107._4_4_ = auVar108._4_4_ * -auVar104._4_4_;
        auVar107._0_4_ = auVar108._0_4_ * -auVar104._0_4_;
        auVar107._8_4_ = auVar108._8_4_ * -auVar104._8_4_;
        auVar107._12_4_ = auVar108._12_4_ * -auVar104._12_4_;
        auVar107._16_4_ = auVar108._16_4_ * -auVar104._16_4_;
        auVar107._20_4_ = auVar108._20_4_ * -auVar104._20_4_;
        auVar107._24_4_ = auVar108._24_4_ * -auVar104._24_4_;
        auVar107._28_4_ = auVar104._28_4_ ^ 0x80000000;
        auVar100 = vmulps_avx512vl(auVar108,ZEXT1632(auVar91));
        auVar103 = ZEXT1632(auVar91);
        auVar106 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar103);
        auVar86 = vfmadd231ps_fma(auVar106,auVar99,auVar99);
        auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
        fVar163 = auVar94._0_4_;
        fVar175 = auVar94._4_4_;
        fVar182 = auVar94._8_4_;
        fVar183 = auVar94._12_4_;
        fVar184 = auVar94._16_4_;
        fVar174 = auVar94._20_4_;
        fVar82 = auVar94._24_4_;
        auVar106._4_4_ = fVar175 * fVar175 * fVar175 * auVar86._4_4_ * -0.5;
        auVar106._0_4_ = fVar163 * fVar163 * fVar163 * auVar86._0_4_ * -0.5;
        auVar106._8_4_ = fVar182 * fVar182 * fVar182 * auVar86._8_4_ * -0.5;
        auVar106._12_4_ = fVar183 * fVar183 * fVar183 * auVar86._12_4_ * -0.5;
        auVar106._16_4_ = fVar184 * fVar184 * fVar184 * -0.0;
        auVar106._20_4_ = fVar174 * fVar174 * fVar174 * -0.0;
        auVar106._24_4_ = fVar82 * fVar82 * fVar82 * -0.0;
        auVar106._28_4_ = 0;
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar92,auVar94);
        auVar93._4_4_ = auVar99._4_4_ * auVar106._4_4_;
        auVar93._0_4_ = auVar99._0_4_ * auVar106._0_4_;
        auVar93._8_4_ = auVar99._8_4_ * auVar106._8_4_;
        auVar93._12_4_ = auVar99._12_4_ * auVar106._12_4_;
        auVar93._16_4_ = auVar99._16_4_ * auVar106._16_4_;
        auVar93._20_4_ = auVar99._20_4_ * auVar106._20_4_;
        auVar93._24_4_ = auVar99._24_4_ * auVar106._24_4_;
        auVar93._28_4_ = auVar94._28_4_;
        auVar94._4_4_ = -auVar111._4_4_ * auVar106._4_4_;
        auVar94._0_4_ = -auVar111._0_4_ * auVar106._0_4_;
        auVar94._8_4_ = -auVar111._8_4_ * auVar106._8_4_;
        auVar94._12_4_ = -auVar111._12_4_ * auVar106._12_4_;
        auVar94._16_4_ = -auVar111._16_4_ * auVar106._16_4_;
        auVar94._20_4_ = -auVar111._20_4_ * auVar106._20_4_;
        auVar94._24_4_ = -auVar111._24_4_ * auVar106._24_4_;
        auVar94._28_4_ = auVar108._28_4_;
        auVar108 = vmulps_avx512vl(auVar106,auVar103);
        auVar86 = vfmadd213ps_fma(auVar109,auVar102,auVar95);
        auVar20 = vfmadd213ps_fma(auVar107,auVar102,auVar96);
        auVar106 = vfmadd213ps_avx512vl(auVar100,auVar102,auVar101);
        auVar92 = vfmadd213ps_avx512vl(auVar93,ZEXT1632(auVar213),auVar97);
        auVar90 = vfnmadd213ps_fma(auVar109,auVar102,auVar95);
        auVar95 = ZEXT1632(auVar213);
        auVar89 = vfmadd213ps_fma(auVar94,auVar95,auVar98);
        auVar24 = vfnmadd213ps_fma(auVar107,auVar102,auVar96);
        auVar21 = vfmadd213ps_fma(auVar108,auVar95,auVar105);
        auVar109 = vfnmadd231ps_avx512vl(auVar101,auVar102,auVar100);
        auVar87 = vfnmadd213ps_fma(auVar93,auVar95,auVar97);
        auVar85 = vfnmadd213ps_fma(auVar94,auVar95,auVar98);
        auVar84 = vfnmadd231ps_fma(auVar105,ZEXT1632(auVar213),auVar108);
        auVar107 = vsubps_avx512vl(auVar92,ZEXT1632(auVar90));
        auVar108 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar24));
        auVar93 = vsubps_avx512vl(ZEXT1632(auVar21),auVar109);
        auVar94 = vmulps_avx512vl(auVar108,auVar109);
        auVar22 = vfmsub231ps_fma(auVar94,ZEXT1632(auVar24),auVar93);
        auVar105._4_4_ = auVar90._4_4_ * auVar93._4_4_;
        auVar105._0_4_ = auVar90._0_4_ * auVar93._0_4_;
        auVar105._8_4_ = auVar90._8_4_ * auVar93._8_4_;
        auVar105._12_4_ = auVar90._12_4_ * auVar93._12_4_;
        auVar105._16_4_ = auVar93._16_4_ * 0.0;
        auVar105._20_4_ = auVar93._20_4_ * 0.0;
        auVar105._24_4_ = auVar93._24_4_ * 0.0;
        auVar105._28_4_ = auVar93._28_4_;
        auVar93 = vfmsub231ps_avx512vl(auVar105,auVar109,auVar107);
        auVar95._4_4_ = auVar24._4_4_ * auVar107._4_4_;
        auVar95._0_4_ = auVar24._0_4_ * auVar107._0_4_;
        auVar95._8_4_ = auVar24._8_4_ * auVar107._8_4_;
        auVar95._12_4_ = auVar24._12_4_ * auVar107._12_4_;
        auVar95._16_4_ = auVar107._16_4_ * 0.0;
        auVar95._20_4_ = auVar107._20_4_ * 0.0;
        auVar95._24_4_ = auVar107._24_4_ * 0.0;
        auVar95._28_4_ = auVar107._28_4_;
        auVar23 = vfmsub231ps_fma(auVar95,ZEXT1632(auVar90),auVar108);
        auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar103,auVar93);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar103,ZEXT1632(auVar22));
        auVar99 = ZEXT1632(auVar91);
        uVar73 = vcmpps_avx512vl(auVar108,auVar99,2);
        bVar72 = (byte)uVar73;
        fVar82 = (float)((uint)(bVar72 & 1) * auVar86._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar87._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        fVar130 = (float)((uint)bVar13 * auVar86._4_4_ | (uint)!bVar13 * auVar87._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        fVar132 = (float)((uint)bVar13 * auVar86._8_4_ | (uint)!bVar13 * auVar87._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        fVar135 = (float)((uint)bVar13 * auVar86._12_4_ | (uint)!bVar13 * auVar87._12_4_);
        auVar94 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar132,CONCAT44(fVar130,fVar82))));
        fVar83 = (float)((uint)(bVar72 & 1) * auVar20._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar85._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        fVar131 = (float)((uint)bVar13 * auVar20._4_4_ | (uint)!bVar13 * auVar85._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        fVar133 = (float)((uint)bVar13 * auVar20._8_4_ | (uint)!bVar13 * auVar85._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        fVar136 = (float)((uint)bVar13 * auVar20._12_4_ | (uint)!bVar13 * auVar85._12_4_);
        auVar105 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar133,CONCAT44(fVar131,fVar83))));
        auVar100._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar84._0_4_
                    );
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar100._4_4_ = (float)((uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar84._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar100._8_4_ = (float)((uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar84._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar100._12_4_ = (float)((uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar84._12_4_);
        fVar163 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar106._16_4_);
        auVar100._16_4_ = fVar163;
        fVar175 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar106._20_4_);
        auVar100._20_4_ = fVar175;
        fVar182 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar106._24_4_);
        auVar100._24_4_ = fVar182;
        iVar1 = (uint)(byte)(uVar73 >> 7) * auVar106._28_4_;
        auVar100._28_4_ = iVar1;
        auVar107 = vblendmps_avx512vl(ZEXT1632(auVar90),auVar92);
        auVar112._0_4_ =
             (uint)(bVar72 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar22._0_4_;
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar22._4_4_;
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar22._8_4_;
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar22._12_4_;
        auVar112._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar107._16_4_;
        auVar112._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar107._20_4_;
        auVar112._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar107._24_4_;
        auVar112._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar107._28_4_;
        auVar107 = vblendmps_avx512vl(ZEXT1632(auVar24),ZEXT1632(auVar89));
        auVar113._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar20._0_4_
                    );
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar20._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar20._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar20._12_4_);
        fVar183 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar107._16_4_);
        auVar113._16_4_ = fVar183;
        fVar184 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar107._20_4_);
        auVar113._20_4_ = fVar184;
        fVar174 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar107._24_4_);
        auVar113._24_4_ = fVar174;
        auVar113._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar107._28_4_;
        auVar107 = vblendmps_avx512vl(auVar109,ZEXT1632(auVar21));
        auVar114._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar107._0_4_ |
                    (uint)!(bool)(bVar72 & 1) * auVar106._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar106._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar106._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar106._12_4_);
        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar13 * auVar107._16_4_ | (uint)!bVar13 * auVar106._16_4_);
        bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar13 * auVar107._20_4_ | (uint)!bVar13 * auVar106._20_4_);
        bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar13 * auVar107._24_4_ | (uint)!bVar13 * auVar106._24_4_);
        bVar13 = SUB81(uVar73 >> 7,0);
        auVar114._28_4_ = (uint)bVar13 * auVar107._28_4_ | (uint)!bVar13 * auVar106._28_4_;
        auVar115._0_4_ =
             (uint)(bVar72 & 1) * (int)auVar90._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar92._0_4_;
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar13 * (int)auVar90._4_4_ | (uint)!bVar13 * auVar92._4_4_;
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar13 * (int)auVar90._8_4_ | (uint)!bVar13 * auVar92._8_4_;
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar13 * (int)auVar90._12_4_ | (uint)!bVar13 * auVar92._12_4_;
        auVar115._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar92._16_4_;
        auVar115._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar92._20_4_;
        auVar115._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar92._24_4_;
        auVar115._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar92._28_4_;
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar73 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar116._0_4_ =
             (uint)(bVar72 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar21._0_4_;
        bVar14 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * auVar21._4_4_;
        bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * auVar21._8_4_;
        bVar14 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * auVar21._12_4_;
        auVar116._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar109._16_4_;
        auVar116._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar109._20_4_;
        auVar116._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar109._24_4_;
        iVar2 = (uint)(byte)(uVar73 >> 7) * auVar109._28_4_;
        auVar116._28_4_ = iVar2;
        auVar95 = vsubps_avx512vl(auVar115,auVar94);
        auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar24._12_4_ |
                                                 (uint)!bVar16 * auVar89._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar24._8_4_ |
                                                          (uint)!bVar15 * auVar89._8_4_,
                                                          CONCAT44((uint)bVar13 * (int)auVar24._4_4_
                                                                   | (uint)!bVar13 * auVar89._4_4_,
                                                                   (uint)(bVar72 & 1) *
                                                                   (int)auVar24._0_4_ |
                                                                   (uint)!(bool)(bVar72 & 1) *
                                                                   auVar89._0_4_)))),auVar105);
        auVar107 = vsubps_avx(auVar116,auVar100);
        auVar106 = vsubps_avx(auVar94,auVar112);
        auVar92 = vsubps_avx(auVar105,auVar113);
        auVar93 = vsubps_avx(auVar100,auVar114);
        auVar96._4_4_ = auVar107._4_4_ * fVar130;
        auVar96._0_4_ = auVar107._0_4_ * fVar82;
        auVar96._8_4_ = auVar107._8_4_ * fVar132;
        auVar96._12_4_ = auVar107._12_4_ * fVar135;
        auVar96._16_4_ = auVar107._16_4_ * 0.0;
        auVar96._20_4_ = auVar107._20_4_ * 0.0;
        auVar96._24_4_ = auVar107._24_4_ * 0.0;
        auVar96._28_4_ = iVar2;
        auVar86 = vfmsub231ps_fma(auVar96,auVar100,auVar95);
        auVar97._4_4_ = fVar131 * auVar95._4_4_;
        auVar97._0_4_ = fVar83 * auVar95._0_4_;
        auVar97._8_4_ = fVar133 * auVar95._8_4_;
        auVar97._12_4_ = fVar136 * auVar95._12_4_;
        auVar97._16_4_ = auVar95._16_4_ * 0.0;
        auVar97._20_4_ = auVar95._20_4_ * 0.0;
        auVar97._24_4_ = auVar95._24_4_ * 0.0;
        auVar97._28_4_ = auVar108._28_4_;
        auVar20 = vfmsub231ps_fma(auVar97,auVar94,auVar109);
        auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar99,ZEXT1632(auVar86));
        auVar178._0_4_ = auVar109._0_4_ * auVar100._0_4_;
        auVar178._4_4_ = auVar109._4_4_ * auVar100._4_4_;
        auVar178._8_4_ = auVar109._8_4_ * auVar100._8_4_;
        auVar178._12_4_ = auVar109._12_4_ * auVar100._12_4_;
        auVar178._16_4_ = auVar109._16_4_ * fVar163;
        auVar178._20_4_ = auVar109._20_4_ * fVar175;
        auVar178._24_4_ = auVar109._24_4_ * fVar182;
        auVar178._28_4_ = 0;
        auVar86 = vfmsub231ps_fma(auVar178,auVar105,auVar107);
        auVar96 = vfmadd231ps_avx512vl(auVar108,auVar99,ZEXT1632(auVar86));
        auVar108 = vmulps_avx512vl(auVar93,auVar112);
        auVar108 = vfmsub231ps_avx512vl(auVar108,auVar106,auVar114);
        auVar98._4_4_ = auVar92._4_4_ * auVar114._4_4_;
        auVar98._0_4_ = auVar92._0_4_ * auVar114._0_4_;
        auVar98._8_4_ = auVar92._8_4_ * auVar114._8_4_;
        auVar98._12_4_ = auVar92._12_4_ * auVar114._12_4_;
        auVar98._16_4_ = auVar92._16_4_ * auVar114._16_4_;
        auVar98._20_4_ = auVar92._20_4_ * auVar114._20_4_;
        auVar98._24_4_ = auVar92._24_4_ * auVar114._24_4_;
        auVar98._28_4_ = auVar114._28_4_;
        auVar86 = vfmsub231ps_fma(auVar98,auVar113,auVar93);
        auVar179._0_4_ = auVar113._0_4_ * auVar106._0_4_;
        auVar179._4_4_ = auVar113._4_4_ * auVar106._4_4_;
        auVar179._8_4_ = auVar113._8_4_ * auVar106._8_4_;
        auVar179._12_4_ = auVar113._12_4_ * auVar106._12_4_;
        auVar179._16_4_ = fVar183 * auVar106._16_4_;
        auVar179._20_4_ = fVar184 * auVar106._20_4_;
        auVar179._24_4_ = fVar174 * auVar106._24_4_;
        auVar179._28_4_ = 0;
        auVar20 = vfmsub231ps_fma(auVar179,auVar92,auVar112);
        auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar99,auVar108);
        auVar97 = vfmadd231ps_avx512vl(auVar108,auVar99,ZEXT1632(auVar86));
        auVar108 = vmaxps_avx(auVar96,auVar97);
        uVar149 = vcmpps_avx512vl(auVar108,auVar99,2);
        bVar81 = bVar81 & (byte)uVar149;
        in_ZMM20 = ZEXT3264(local_440);
        in_ZMM21 = ZEXT3264(local_460);
        auVar212 = ZEXT3264(local_3c0);
        if (bVar81 == 0) {
          bVar81 = 0;
          auVar195 = ZEXT3264(local_580);
          auVar173 = ZEXT3264(local_5e0);
        }
        else {
          auVar38._4_4_ = auVar93._4_4_ * auVar109._4_4_;
          auVar38._0_4_ = auVar93._0_4_ * auVar109._0_4_;
          auVar38._8_4_ = auVar93._8_4_ * auVar109._8_4_;
          auVar38._12_4_ = auVar93._12_4_ * auVar109._12_4_;
          auVar38._16_4_ = auVar93._16_4_ * auVar109._16_4_;
          auVar38._20_4_ = auVar93._20_4_ * auVar109._20_4_;
          auVar38._24_4_ = auVar93._24_4_ * auVar109._24_4_;
          auVar38._28_4_ = auVar108._28_4_;
          auVar89 = vfmsub231ps_fma(auVar38,auVar92,auVar107);
          auVar39._4_4_ = auVar107._4_4_ * auVar106._4_4_;
          auVar39._0_4_ = auVar107._0_4_ * auVar106._0_4_;
          auVar39._8_4_ = auVar107._8_4_ * auVar106._8_4_;
          auVar39._12_4_ = auVar107._12_4_ * auVar106._12_4_;
          auVar39._16_4_ = auVar107._16_4_ * auVar106._16_4_;
          auVar39._20_4_ = auVar107._20_4_ * auVar106._20_4_;
          auVar39._24_4_ = auVar107._24_4_ * auVar106._24_4_;
          auVar39._28_4_ = auVar107._28_4_;
          auVar20 = vfmsub231ps_fma(auVar39,auVar95,auVar93);
          auVar40._4_4_ = auVar92._4_4_ * auVar95._4_4_;
          auVar40._0_4_ = auVar92._0_4_ * auVar95._0_4_;
          auVar40._8_4_ = auVar92._8_4_ * auVar95._8_4_;
          auVar40._12_4_ = auVar92._12_4_ * auVar95._12_4_;
          auVar40._16_4_ = auVar92._16_4_ * auVar95._16_4_;
          auVar40._20_4_ = auVar92._20_4_ * auVar95._20_4_;
          auVar40._24_4_ = auVar92._24_4_ * auVar95._24_4_;
          auVar40._28_4_ = auVar92._28_4_;
          auVar21 = vfmsub231ps_fma(auVar40,auVar106,auVar109);
          auVar86 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar20),ZEXT1632(auVar21));
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar89),auVar99);
          auVar109 = vrcp14ps_avx512vl(auVar108);
          auVar29._8_4_ = 0x3f800000;
          auVar29._0_8_ = &DAT_3f8000003f800000;
          auVar29._12_4_ = 0x3f800000;
          auVar29._16_4_ = 0x3f800000;
          auVar29._20_4_ = 0x3f800000;
          auVar29._24_4_ = 0x3f800000;
          auVar29._28_4_ = 0x3f800000;
          auVar107 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar29);
          auVar86 = vfmadd132ps_fma(auVar107,auVar109,auVar109);
          auVar41._4_4_ = auVar21._4_4_ * auVar100._4_4_;
          auVar41._0_4_ = auVar21._0_4_ * auVar100._0_4_;
          auVar41._8_4_ = auVar21._8_4_ * auVar100._8_4_;
          auVar41._12_4_ = auVar21._12_4_ * auVar100._12_4_;
          auVar41._16_4_ = fVar163 * 0.0;
          auVar41._20_4_ = fVar175 * 0.0;
          auVar41._24_4_ = fVar182 * 0.0;
          auVar41._28_4_ = iVar1;
          auVar20 = vfmadd231ps_fma(auVar41,auVar105,ZEXT1632(auVar20));
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar94,ZEXT1632(auVar89));
          fVar175 = auVar86._0_4_;
          fVar182 = auVar86._4_4_;
          fVar183 = auVar86._8_4_;
          fVar184 = auVar86._12_4_;
          auVar109 = ZEXT1632(CONCAT412(auVar20._12_4_ * fVar184,
                                        CONCAT48(auVar20._8_4_ * fVar183,
                                                 CONCAT44(auVar20._4_4_ * fVar182,
                                                          auVar20._0_4_ * fVar175))));
          auVar198._4_4_ = uVar75;
          auVar198._0_4_ = uVar75;
          auVar198._8_4_ = uVar75;
          auVar198._12_4_ = uVar75;
          auVar198._16_4_ = uVar75;
          auVar198._20_4_ = uVar75;
          auVar198._24_4_ = uVar75;
          auVar198._28_4_ = uVar75;
          uVar149 = vcmpps_avx512vl(auVar198,auVar109,2);
          fVar163 = (ray->super_RayK<1>).tfar;
          auVar30._4_4_ = fVar163;
          auVar30._0_4_ = fVar163;
          auVar30._8_4_ = fVar163;
          auVar30._12_4_ = fVar163;
          auVar30._16_4_ = fVar163;
          auVar30._20_4_ = fVar163;
          auVar30._24_4_ = fVar163;
          auVar30._28_4_ = fVar163;
          uVar25 = vcmpps_avx512vl(auVar109,auVar30,2);
          bVar81 = (byte)uVar149 & (byte)uVar25 & bVar81;
          if (bVar81 == 0) {
            bVar81 = 0;
            auVar195 = ZEXT3264(local_580);
            auVar173 = ZEXT3264(local_5e0);
          }
          else {
            uVar149 = vcmpps_avx512vl(auVar108,auVar99,4);
            if ((bVar81 & (byte)uVar149) == 0) {
              bVar81 = 0;
              auVar195 = ZEXT3264(local_580);
              auVar173 = ZEXT3264(local_5e0);
            }
            else {
              bVar81 = bVar81 & (byte)uVar149;
              fVar163 = auVar96._0_4_ * fVar175;
              fVar174 = auVar96._4_4_ * fVar182;
              auVar42._4_4_ = fVar174;
              auVar42._0_4_ = fVar163;
              fVar82 = auVar96._8_4_ * fVar183;
              auVar42._8_4_ = fVar82;
              fVar83 = auVar96._12_4_ * fVar184;
              auVar42._12_4_ = fVar83;
              fVar130 = auVar96._16_4_ * 0.0;
              auVar42._16_4_ = fVar130;
              fVar131 = auVar96._20_4_ * 0.0;
              auVar42._20_4_ = fVar131;
              fVar132 = auVar96._24_4_ * 0.0;
              auVar42._24_4_ = fVar132;
              auVar42._28_4_ = auVar96._28_4_;
              fVar175 = auVar97._0_4_ * fVar175;
              fVar182 = auVar97._4_4_ * fVar182;
              auVar43._4_4_ = fVar182;
              auVar43._0_4_ = fVar175;
              fVar183 = auVar97._8_4_ * fVar183;
              auVar43._8_4_ = fVar183;
              fVar184 = auVar97._12_4_ * fVar184;
              auVar43._12_4_ = fVar184;
              fVar133 = auVar97._16_4_ * 0.0;
              auVar43._16_4_ = fVar133;
              fVar135 = auVar97._20_4_ * 0.0;
              auVar43._20_4_ = fVar135;
              fVar136 = auVar97._24_4_ * 0.0;
              auVar43._24_4_ = fVar136;
              auVar43._28_4_ = auVar97._28_4_;
              auVar190._8_4_ = 0x3f800000;
              auVar190._0_8_ = &DAT_3f8000003f800000;
              auVar190._12_4_ = 0x3f800000;
              auVar190._16_4_ = 0x3f800000;
              auVar190._20_4_ = 0x3f800000;
              auVar190._24_4_ = 0x3f800000;
              auVar190._28_4_ = 0x3f800000;
              auVar108 = vsubps_avx(auVar190,auVar42);
              bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar73 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar73 >> 6) & 1);
              bVar19 = SUB81(uVar73 >> 7,0);
              auVar195 = ZEXT3264(CONCAT428((uint)bVar19 * auVar96._28_4_ |
                                            (uint)!bVar19 * auVar108._28_4_,
                                            CONCAT424((uint)bVar18 * (int)fVar132 |
                                                      (uint)!bVar18 * auVar108._24_4_,
                                                      CONCAT420((uint)bVar17 * (int)fVar131 |
                                                                (uint)!bVar17 * auVar108._20_4_,
                                                                CONCAT416((uint)bVar16 *
                                                                          (int)fVar130 |
                                                                          (uint)!bVar16 *
                                                                          auVar108._16_4_,
                                                                          CONCAT412((uint)bVar15 *
                                                                                    (int)fVar83 |
                                                                                    (uint)!bVar15 *
                                                                                    auVar108._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar14 * (int)fVar82 |
                                                  (uint)!bVar14 * auVar108._8_4_,
                                                  CONCAT44((uint)bVar13 * (int)fVar174 |
                                                           (uint)!bVar13 * auVar108._4_4_,
                                                           (uint)(bVar72 & 1) * (int)fVar163 |
                                                           (uint)!(bool)(bVar72 & 1) *
                                                           auVar108._0_4_))))))));
              auVar108 = vsubps_avx(auVar190,auVar43);
              bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar73 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar73 >> 6) & 1);
              bVar19 = SUB81(uVar73 >> 7,0);
              local_220._4_4_ = (uint)bVar13 * (int)fVar182 | (uint)!bVar13 * auVar108._4_4_;
              local_220._0_4_ =
                   (uint)(bVar72 & 1) * (int)fVar175 | (uint)!(bool)(bVar72 & 1) * auVar108._0_4_;
              local_220._8_4_ = (uint)bVar14 * (int)fVar183 | (uint)!bVar14 * auVar108._8_4_;
              local_220._12_4_ = (uint)bVar15 * (int)fVar184 | (uint)!bVar15 * auVar108._12_4_;
              local_220._16_4_ = (uint)bVar16 * (int)fVar133 | (uint)!bVar16 * auVar108._16_4_;
              local_220._20_4_ = (uint)bVar17 * (int)fVar135 | (uint)!bVar17 * auVar108._20_4_;
              local_220._24_4_ = (uint)bVar18 * (int)fVar136 | (uint)!bVar18 * auVar108._24_4_;
              local_220._28_4_ = (uint)bVar19 * auVar97._28_4_ | (uint)!bVar19 * auVar108._28_4_;
              auVar173 = ZEXT3264(auVar109);
            }
          }
        }
        auVar217 = ZEXT3264(local_4a0);
        auVar216 = ZEXT3264(local_480);
        auVar199 = ZEXT1664(local_600);
        if (bVar81 != 0) {
          auVar108 = vsubps_avx(ZEXT1632(auVar213),auVar102);
          local_360 = auVar195._0_32_;
          auVar86 = vfmadd213ps_fma(auVar108,local_360,auVar102);
          fVar163 = pre->depth_scale;
          auVar102._4_4_ = fVar163;
          auVar102._0_4_ = fVar163;
          auVar102._8_4_ = fVar163;
          auVar102._12_4_ = fVar163;
          auVar102._16_4_ = fVar163;
          auVar102._20_4_ = fVar163;
          auVar102._24_4_ = fVar163;
          auVar102._28_4_ = fVar163;
          auVar108 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                                        CONCAT48(auVar86._8_4_ + auVar86._8_4_,
                                                                 CONCAT44(auVar86._4_4_ +
                                                                          auVar86._4_4_,
                                                                          auVar86._0_4_ +
                                                                          auVar86._0_4_)))),auVar102
                                    );
          local_320 = auVar173._0_32_;
          uVar149 = vcmpps_avx512vl(local_320,auVar108,6);
          bVar81 = bVar81 & (byte)uVar149;
          if (bVar81 != 0) {
            auVar142._8_4_ = 0xbf800000;
            auVar142._0_8_ = 0xbf800000bf800000;
            auVar142._12_4_ = 0xbf800000;
            auVar142._16_4_ = 0xbf800000;
            auVar142._20_4_ = 0xbf800000;
            auVar142._24_4_ = 0xbf800000;
            auVar142._28_4_ = 0xbf800000;
            auVar31._8_4_ = 0x40000000;
            auVar31._0_8_ = 0x4000000040000000;
            auVar31._12_4_ = 0x40000000;
            auVar31._16_4_ = 0x40000000;
            auVar31._20_4_ = 0x40000000;
            auVar31._24_4_ = 0x40000000;
            auVar31._28_4_ = 0x40000000;
            local_220 = vfmadd132ps_avx512vl(local_220,auVar142,auVar31);
            auVar108 = local_220;
            local_340 = local_220;
            local_300 = 0;
            local_2fc = iVar10;
            local_2f0 = local_600;
            local_2e0 = local_550;
            uStack_2d8 = uStack_548;
            local_2d0 = local_560;
            uStack_2c8 = uStack_558;
            local_2b0 = bVar81;
            local_220 = auVar108;
            if ((pGVar11->mask & (ray->super_RayK<1>).mask) != 0) {
              fVar163 = 1.0 / (float)local_380._0_4_;
              local_2a0[0] = fVar163 * (auVar195._0_4_ + 0.0);
              local_2a0[1] = fVar163 * (auVar195._4_4_ + 1.0);
              local_2a0[2] = fVar163 * (auVar195._8_4_ + 2.0);
              local_2a0[3] = fVar163 * (auVar195._12_4_ + 3.0);
              fStack_290 = fVar163 * (auVar195._16_4_ + 4.0);
              fStack_28c = fVar163 * (auVar195._20_4_ + 5.0);
              fStack_288 = fVar163 * (auVar195._24_4_ + 6.0);
              fStack_284 = auVar195._28_4_ + 7.0;
              local_280 = local_220._0_8_;
              uStack_278 = local_220._8_8_;
              uStack_270 = local_220._16_8_;
              uStack_268 = local_220._24_8_;
              local_260 = local_320;
              auVar143._8_4_ = 0x7f800000;
              auVar143._0_8_ = 0x7f8000007f800000;
              auVar143._12_4_ = 0x7f800000;
              auVar143._16_4_ = 0x7f800000;
              auVar143._20_4_ = 0x7f800000;
              auVar143._24_4_ = 0x7f800000;
              auVar143._28_4_ = 0x7f800000;
              auVar109 = vblendmps_avx512vl(auVar143,local_320);
              auVar117._0_4_ =
                   (uint)(bVar81 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar81 & 1) * 0x7f800000;
              bVar13 = (bool)(bVar81 >> 1 & 1);
              auVar117._4_4_ = (uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar81 >> 2 & 1);
              auVar117._8_4_ = (uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar81 >> 3 & 1);
              auVar117._12_4_ = (uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar81 >> 4 & 1);
              auVar117._16_4_ = (uint)bVar13 * auVar109._16_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar81 >> 5 & 1);
              auVar117._20_4_ = (uint)bVar13 * auVar109._20_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar81 >> 6 & 1);
              auVar117._24_4_ = (uint)bVar13 * auVar109._24_4_ | (uint)!bVar13 * 0x7f800000;
              auVar117._28_4_ =
                   (uint)(bVar81 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar81 >> 7) * 0x7f800000;
              auVar109 = vshufps_avx(auVar117,auVar117,0xb1);
              auVar109 = vminps_avx(auVar117,auVar109);
              auVar107 = vshufpd_avx(auVar109,auVar109,5);
              auVar109 = vminps_avx(auVar109,auVar107);
              auVar107 = vpermpd_avx2(auVar109,0x4e);
              auVar109 = vminps_avx(auVar109,auVar107);
              uVar149 = vcmpps_avx512vl(auVar117,auVar109,0);
              bVar71 = (byte)uVar149 & bVar81;
              bVar72 = bVar81;
              if (bVar71 != 0) {
                bVar72 = bVar71;
              }
              uVar26 = 0;
              for (uVar74 = (uint)bVar72; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
                uVar26 = uVar26 + 1;
              }
              uVar73 = (ulong)uVar26;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar163 = local_2a0[uVar73];
                fVar175 = *(float *)((long)&local_280 + uVar73 * 4);
                fVar183 = 1.0 - fVar163;
                fVar182 = fVar183 * fVar183 * -3.0;
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar183 * fVar183)),
                                          ZEXT416((uint)(fVar163 * fVar183)),ZEXT416(0xc0000000));
                auVar213 = vfmsub132ss_fma(ZEXT416((uint)(fVar163 * fVar183)),
                                           ZEXT416((uint)(fVar163 * fVar163)),ZEXT416(0x40000000));
                fVar183 = auVar86._0_4_ * 3.0;
                fVar184 = auVar213._0_4_ * 3.0;
                fVar174 = fVar163 * fVar163 * 3.0;
                auVar195 = ZEXT3264(local_360);
                auVar186._0_4_ = fVar174 * local_540;
                auVar186._4_4_ = fVar174 * fStack_53c;
                auVar186._8_4_ = fVar174 * fStack_538;
                auVar186._12_4_ = fVar174 * fStack_534;
                auVar155._4_4_ = fVar184;
                auVar155._0_4_ = fVar184;
                auVar155._8_4_ = fVar184;
                auVar155._12_4_ = fVar184;
                auVar86 = vfmadd132ps_fma(auVar155,auVar186,*pauVar4);
                auVar168._4_4_ = fVar183;
                auVar168._0_4_ = fVar183;
                auVar168._8_4_ = fVar183;
                auVar168._12_4_ = fVar183;
                auVar86 = vfmadd132ps_fma(auVar168,auVar86,*pauVar3);
                auVar156._4_4_ = fVar182;
                auVar156._0_4_ = fVar182;
                auVar156._8_4_ = fVar182;
                auVar156._12_4_ = fVar182;
                (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar73 * 4);
                auVar86 = vfmadd213ps_fma(auVar156,local_600,auVar86);
                auVar173 = ZEXT3264(local_320);
                uVar149 = vmovlps_avx(auVar86);
                *(undefined8 *)&(ray->Ng).field_0 = uVar149;
                fVar182 = (float)vextractps_avx(auVar86,2);
                (ray->Ng).field_0.field_0.z = fVar182;
                ray->u = fVar163;
                ray->v = fVar175;
                ray->primID = uVar76;
                ray->geomID = uVar79;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_410 = (float)local_550;
                uStack_40c = (undefined4)((ulong)local_550 >> 0x20);
                uStack_408 = uStack_548;
                local_4b0 = (Geometry *)local_560;
                uStack_4a8 = uStack_558;
                local_610 = prim;
                local_618 = context;
                local_620 = pre;
                local_580 = local_360;
                local_5e0 = local_320;
                local_420 = local_540;
                fStack_41c = fStack_53c;
                fStack_418 = fStack_538;
                fStack_414 = fStack_534;
                do {
                  auVar213 = auVar214._0_16_;
                  local_524 = local_2a0[uVar73];
                  local_520 = *(undefined4 *)((long)&local_280 + uVar73 * 4);
                  fVar163 = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar73 * 4);
                  local_5b0.context = context->user;
                  fVar182 = 1.0 - local_524;
                  fVar175 = fVar182 * fVar182 * -3.0;
                  auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar182 * fVar182)),
                                            ZEXT416((uint)(local_524 * fVar182)),ZEXT416(0xc0000000)
                                           );
                  auVar86 = vfmsub132ss_fma(ZEXT416((uint)(local_524 * fVar182)),
                                            ZEXT416((uint)(local_524 * local_524)),
                                            ZEXT416(0x40000000));
                  fVar182 = auVar88._0_4_ * 3.0;
                  fVar183 = auVar86._0_4_ * 3.0;
                  fVar184 = local_524 * local_524 * 3.0;
                  auVar189._0_4_ = fVar184 * local_420;
                  auVar189._4_4_ = fVar184 * fStack_41c;
                  auVar189._8_4_ = fVar184 * fStack_418;
                  auVar189._12_4_ = fVar184 * fStack_414;
                  auVar161._4_4_ = fVar183;
                  auVar161._0_4_ = fVar183;
                  auVar161._8_4_ = fVar183;
                  auVar161._12_4_ = fVar183;
                  auVar66._8_8_ = uStack_4a8;
                  auVar66._0_8_ = local_4b0;
                  auVar88 = vfmadd132ps_fma(auVar161,auVar189,auVar66);
                  auVar171._4_4_ = fVar182;
                  auVar171._0_4_ = fVar182;
                  auVar171._8_4_ = fVar182;
                  auVar171._12_4_ = fVar182;
                  auVar68._4_4_ = uStack_40c;
                  auVar68._0_4_ = local_410;
                  auVar68._8_8_ = uStack_408;
                  auVar88 = vfmadd132ps_fma(auVar171,auVar88,auVar68);
                  auVar162._4_4_ = fVar175;
                  auVar162._0_4_ = fVar175;
                  auVar162._8_4_ = fVar175;
                  auVar162._12_4_ = fVar175;
                  auVar88 = vfmadd213ps_fma(auVar162,auVar199._0_16_,auVar88);
                  local_530 = vmovlps_avx(auVar88);
                  local_528 = vextractps_avx(auVar88,2);
                  local_51c = (int)local_5e8;
                  local_518 = (int)local_608;
                  local_514 = (local_5b0.context)->instID[0];
                  local_510 = (local_5b0.context)->instPrimID[0];
                  local_624 = -1;
                  local_5b0.valid = &local_624;
                  local_5b0.geometryUserPtr = pGVar11->userPtr;
                  local_5b0.ray = (RTCRayN *)ray;
                  local_5b0.hit = (RTCHitN *)&local_530;
                  local_5b0.N = 1;
                  local_3a0 = (uint)uVar73;
                  uStack_39c = (uint)(uVar73 >> 0x20);
                  if (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b96c58:
                    auVar88 = auVar214._0_16_;
                    p_Var12 = context->args->filter;
                    if (p_Var12 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var12)(&local_5b0);
                        uVar73 = CONCAT44(uStack_39c,local_3a0);
                        auVar215 = ZEXT1664(local_3e0._0_16_);
                        auVar217 = ZEXT3264(local_4a0);
                        auVar216 = ZEXT3264(local_480);
                        auVar211 = ZEXT3264(local_500);
                        auVar210 = ZEXT3264(local_4e0);
                        auVar212 = ZEXT3264(local_3c0);
                        auVar199 = ZEXT1664(local_600);
                        in_ZMM21 = ZEXT3264(local_460);
                        in_ZMM20 = ZEXT3264(local_440);
                        auVar88 = vxorps_avx512vl(auVar88,auVar88);
                        auVar214 = ZEXT1664(auVar88);
                        prim = local_610;
                        context = local_618;
                        pre = local_620;
                        uVar75 = local_400._0_4_;
                      }
                      if (*local_5b0.valid == 0) goto LAB_01b96d64;
                    }
                    (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_5b0.hit;
                    (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_5b0.hit + 4);
                    (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_5b0.hit + 8);
                    *(float *)((long)local_5b0.ray + 0x3c) = *(float *)(local_5b0.hit + 0xc);
                    *(float *)((long)local_5b0.ray + 0x40) = *(float *)(local_5b0.hit + 0x10);
                    *(float *)((long)local_5b0.ray + 0x44) = *(float *)(local_5b0.hit + 0x14);
                    *(float *)((long)local_5b0.ray + 0x48) = *(float *)(local_5b0.hit + 0x18);
                    *(float *)((long)local_5b0.ray + 0x4c) = *(float *)(local_5b0.hit + 0x1c);
                    *(float *)((long)local_5b0.ray + 0x50) = *(float *)(local_5b0.hit + 0x20);
                  }
                  else {
                    (*pGVar11->intersectionFilterN)(&local_5b0);
                    uVar73 = CONCAT44(uStack_39c,local_3a0);
                    auVar215 = ZEXT1664(local_3e0._0_16_);
                    auVar217 = ZEXT3264(local_4a0);
                    auVar216 = ZEXT3264(local_480);
                    auVar211 = ZEXT3264(local_500);
                    auVar210 = ZEXT3264(local_4e0);
                    auVar212 = ZEXT3264(local_3c0);
                    auVar199 = ZEXT1664(local_600);
                    in_ZMM21 = ZEXT3264(local_460);
                    in_ZMM20 = ZEXT3264(local_440);
                    auVar88 = vxorps_avx512vl(auVar213,auVar213);
                    auVar214 = ZEXT1664(auVar88);
                    prim = local_610;
                    context = local_618;
                    pre = local_620;
                    uVar75 = local_400._0_4_;
                    if (*local_5b0.valid != 0) goto LAB_01b96c58;
LAB_01b96d64:
                    (ray->super_RayK<1>).tfar = fVar163;
                  }
                  auVar88 = auVar215._0_16_;
                  auVar173 = ZEXT3264(local_5e0);
                  bVar72 = ~(byte)(1 << ((uint)uVar73 & 0x1f)) & bVar81;
                  fVar163 = (ray->super_RayK<1>).tfar;
                  auVar37._4_4_ = fVar163;
                  auVar37._0_4_ = fVar163;
                  auVar37._8_4_ = fVar163;
                  auVar37._12_4_ = fVar163;
                  auVar37._16_4_ = fVar163;
                  auVar37._20_4_ = fVar163;
                  auVar37._24_4_ = fVar163;
                  auVar37._28_4_ = fVar163;
                  uVar149 = vcmpps_avx512vl(local_5e0,auVar37,2);
                  bVar81 = bVar72 & (byte)uVar149;
                  auVar195 = ZEXT3264(local_580);
                  if ((bVar72 & (byte)uVar149) != 0) {
                    auVar148._8_4_ = 0x7f800000;
                    auVar148._0_8_ = 0x7f8000007f800000;
                    auVar148._12_4_ = 0x7f800000;
                    auVar148._16_4_ = 0x7f800000;
                    auVar148._20_4_ = 0x7f800000;
                    auVar148._24_4_ = 0x7f800000;
                    auVar148._28_4_ = 0x7f800000;
                    auVar108 = vblendmps_avx512vl(auVar148,local_5e0);
                    auVar129._0_4_ =
                         (uint)(bVar81 & 1) * auVar108._0_4_ |
                         (uint)!(bool)(bVar81 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar81 >> 1 & 1);
                    auVar129._4_4_ = (uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar81 >> 2 & 1);
                    auVar129._8_4_ = (uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar81 >> 3 & 1);
                    auVar129._12_4_ = (uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar81 >> 4 & 1);
                    auVar129._16_4_ = (uint)bVar13 * auVar108._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar81 >> 5 & 1);
                    auVar129._20_4_ = (uint)bVar13 * auVar108._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar81 >> 6 & 1);
                    auVar129._24_4_ = (uint)bVar13 * auVar108._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar129._28_4_ =
                         (uint)(bVar81 >> 7) * auVar108._28_4_ |
                         (uint)!(bool)(bVar81 >> 7) * 0x7f800000;
                    auVar108 = vshufps_avx(auVar129,auVar129,0xb1);
                    auVar108 = vminps_avx(auVar129,auVar108);
                    auVar109 = vshufpd_avx(auVar108,auVar108,5);
                    auVar108 = vminps_avx(auVar108,auVar109);
                    auVar109 = vpermpd_avx2(auVar108,0x4e);
                    auVar108 = vminps_avx(auVar108,auVar109);
                    uVar149 = vcmpps_avx512vl(auVar129,auVar108,0);
                    bVar71 = (byte)uVar149 & bVar81;
                    bVar72 = bVar81;
                    if (bVar71 != 0) {
                      bVar72 = bVar71;
                    }
                    uVar79 = 0;
                    for (uVar76 = (uint)bVar72; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000
                        ) {
                      uVar79 = uVar79 + 1;
                    }
                    uVar73 = (ulong)uVar79;
                  }
                } while (bVar81 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar10) {
        local_3e0 = vpbroadcastd_avx512vl();
        local_400 = vbroadcastss_avx512vl(auVar88);
        local_3a0 = uVar75;
        uStack_39c = uVar75;
        uStack_398 = uVar75;
        uStack_394 = uVar75;
        uStack_390 = uVar75;
        uStack_38c = uVar75;
        uStack_388 = uVar75;
        uStack_384 = uVar75;
        local_380._4_4_ = 1.0 / (float)local_380._0_4_;
        local_380._0_4_ = local_380._4_4_;
        fStack_378 = (float)local_380._4_4_;
        fStack_374 = (float)local_380._4_4_;
        fStack_370 = (float)local_380._4_4_;
        fStack_36c = (float)local_380._4_4_;
        fStack_368 = (float)local_380._4_4_;
        fStack_364 = (float)local_380._4_4_;
        lVar77 = 8;
        local_580 = auVar195._0_32_;
        local_5e0 = auVar173._0_32_;
        do {
          auVar108 = vpbroadcastd_avx512vl();
          auVar92 = vpor_avx2(auVar108,_DAT_0205a920);
          uVar25 = vpcmpd_avx512vl(auVar92,local_3e0,1);
          auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar77 * 4 + lVar27);
          auVar109 = *(undefined1 (*) [32])(lVar27 + 0x2227768 + lVar77 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar27 + 0x2227bec + lVar77 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar27 + 0x2228070 + lVar77 * 4);
          local_480 = auVar216._0_32_;
          auVar93 = vmulps_avx512vl(local_480,auVar106);
          local_4a0 = auVar217._0_32_;
          auVar94 = vmulps_avx512vl(local_4a0,auVar106);
          auVar44._4_4_ = auVar106._4_4_ * (float)local_120._4_4_;
          auVar44._0_4_ = auVar106._0_4_ * (float)local_120._0_4_;
          auVar44._8_4_ = auVar106._8_4_ * fStack_118;
          auVar44._12_4_ = auVar106._12_4_ * fStack_114;
          auVar44._16_4_ = auVar106._16_4_ * fStack_110;
          auVar44._20_4_ = auVar106._20_4_ * fStack_10c;
          auVar44._24_4_ = auVar106._24_4_ * fStack_108;
          auVar44._28_4_ = auVar92._28_4_;
          auVar92 = vfmadd231ps_avx512vl(auVar93,auVar107,local_c0);
          auVar93 = vfmadd231ps_avx512vl(auVar94,auVar107,local_e0);
          auVar94 = vfmadd231ps_avx512vl(auVar44,auVar107,local_100);
          auVar110 = auVar211._0_32_;
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar109,auVar110);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar109,local_1c0);
          auVar88 = vfmadd231ps_fma(auVar94,auVar109,local_a0);
          auVar111 = auVar212._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar92,auVar108,auVar111);
          auVar104 = auVar210._0_32_;
          auVar98 = vfmadd231ps_avx512vl(auVar93,auVar108,auVar104);
          auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar77 * 4 + lVar27);
          auVar93 = *(undefined1 (*) [32])(lVar27 + 0x2229b88 + lVar77 * 4);
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar108,local_80);
          auVar94 = *(undefined1 (*) [32])(lVar27 + 0x222a00c + lVar77 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar27 + 0x222a490 + lVar77 * 4);
          auVar95 = vmulps_avx512vl(local_480,auVar105);
          auVar96 = vmulps_avx512vl(local_4a0,auVar105);
          auVar45._4_4_ = auVar105._4_4_ * (float)local_120._4_4_;
          auVar45._0_4_ = auVar105._0_4_ * (float)local_120._0_4_;
          auVar45._8_4_ = auVar105._8_4_ * fStack_118;
          auVar45._12_4_ = auVar105._12_4_ * fStack_114;
          auVar45._16_4_ = auVar105._16_4_ * fStack_110;
          auVar45._20_4_ = auVar105._20_4_ * fStack_10c;
          auVar45._24_4_ = auVar105._24_4_ * fStack_108;
          auVar45._28_4_ = uStack_104;
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar94,local_c0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,local_e0);
          auVar99 = vfmadd231ps_avx512vl(auVar45,auVar94,local_100);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar110);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_1c0);
          auVar86 = vfmadd231ps_fma(auVar99,auVar93,local_a0);
          auVar99 = vfmadd231ps_avx512vl(auVar95,auVar92,auVar111);
          auVar100 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar104);
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar92,local_80);
          auVar101 = vmaxps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar86));
          auVar95 = vsubps_avx(auVar99,auVar97);
          auVar96 = vsubps_avx(auVar100,auVar98);
          auVar102 = vmulps_avx512vl(auVar98,auVar95);
          auVar103 = vmulps_avx512vl(auVar97,auVar96);
          auVar102 = vsubps_avx512vl(auVar102,auVar103);
          auVar103 = vmulps_avx512vl(auVar96,auVar96);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar95,auVar95);
          auVar101 = vmulps_avx512vl(auVar101,auVar101);
          auVar101 = vmulps_avx512vl(auVar101,auVar103);
          auVar102 = vmulps_avx512vl(auVar102,auVar102);
          uVar149 = vcmpps_avx512vl(auVar102,auVar101,2);
          local_2b0 = (byte)uVar25 & (byte)uVar149;
          if (local_2b0 == 0) {
            auVar195 = ZEXT3264(local_580);
            auVar173 = ZEXT3264(local_5e0);
            auVar210 = ZEXT3264(auVar104);
            auVar211 = ZEXT3264(auVar110);
          }
          else {
            auVar105 = vmulps_avx512vl(local_1a0,auVar105);
            auVar94 = vfmadd213ps_avx512vl(auVar94,local_180,auVar105);
            auVar93 = vfmadd213ps_avx512vl(auVar93,local_160,auVar94);
            auVar92 = vfmadd213ps_avx512vl(auVar92,local_140,auVar93);
            auVar106 = vmulps_avx512vl(local_1a0,auVar106);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_180,auVar106);
            auVar109 = vfmadd213ps_avx512vl(auVar109,local_160,auVar107);
            auVar93 = vfmadd213ps_avx512vl(auVar108,local_140,auVar109);
            auVar108 = *(undefined1 (*) [32])(lVar27 + 0x22284f4 + lVar77 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar27 + 0x2228978 + lVar77 * 4);
            auVar107 = *(undefined1 (*) [32])(lVar27 + 0x2228dfc + lVar77 * 4);
            auVar106 = *(undefined1 (*) [32])(lVar27 + 0x2229280 + lVar77 * 4);
            auVar94 = vmulps_avx512vl(local_480,auVar106);
            auVar105 = vmulps_avx512vl(local_4a0,auVar106);
            auVar106 = vmulps_avx512vl(local_1a0,auVar106);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar107,local_c0);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,local_e0);
            auVar107 = vfmadd231ps_avx512vl(auVar106,local_180,auVar107);
            auVar106 = vfmadd231ps_avx512vl(auVar94,auVar109,auVar110);
            auVar94 = vfmadd231ps_avx512vl(auVar105,auVar109,local_1c0);
            auVar109 = vfmadd231ps_avx512vl(auVar107,local_160,auVar109);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar108,auVar111);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar108,auVar104);
            auVar105 = vfmadd231ps_avx512vl(auVar109,local_140,auVar108);
            auVar108 = *(undefined1 (*) [32])(lVar27 + 0x222a914 + lVar77 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar27 + 0x222b21c + lVar77 * 4);
            auVar107 = *(undefined1 (*) [32])(lVar27 + 0x222b6a0 + lVar77 * 4);
            auVar101 = vmulps_avx512vl(local_480,auVar107);
            auVar102 = vmulps_avx512vl(local_4a0,auVar107);
            auVar107 = vmulps_avx512vl(local_1a0,auVar107);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar109,local_c0);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar109,local_e0);
            auVar107 = vfmadd231ps_avx512vl(auVar107,local_180,auVar109);
            auVar109 = *(undefined1 (*) [32])(lVar27 + 0x222ad98 + lVar77 * 4);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar109,auVar110);
            auVar213 = vfmadd231ps_fma(auVar102,auVar109,local_1c0);
            auVar109 = vfmadd231ps_avx512vl(auVar107,local_160,auVar109);
            auVar107 = vfmadd231ps_avx512vl(auVar101,auVar108,auVar111);
            auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar213),auVar108,auVar104);
            auVar109 = vfmadd231ps_avx512vl(auVar109,local_140,auVar108);
            auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar106,auVar102);
            vandps_avx512vl(auVar94,auVar102);
            auVar108 = vmaxps_avx(auVar102,auVar102);
            vandps_avx512vl(auVar105,auVar102);
            auVar108 = vmaxps_avx(auVar108,auVar102);
            uVar73 = vcmpps_avx512vl(auVar108,local_400,1);
            bVar13 = (bool)((byte)uVar73 & 1);
            auVar118._0_4_ = (float)((uint)bVar13 * auVar95._0_4_ | (uint)!bVar13 * auVar106._0_4_);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar118._4_4_ = (float)((uint)bVar13 * auVar95._4_4_ | (uint)!bVar13 * auVar106._4_4_);
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar118._8_4_ = (float)((uint)bVar13 * auVar95._8_4_ | (uint)!bVar13 * auVar106._8_4_);
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar118._12_4_ =
                 (float)((uint)bVar13 * auVar95._12_4_ | (uint)!bVar13 * auVar106._12_4_);
            bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar118._16_4_ =
                 (float)((uint)bVar13 * auVar95._16_4_ | (uint)!bVar13 * auVar106._16_4_);
            bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar118._20_4_ =
                 (float)((uint)bVar13 * auVar95._20_4_ | (uint)!bVar13 * auVar106._20_4_);
            bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar118._24_4_ =
                 (float)((uint)bVar13 * auVar95._24_4_ | (uint)!bVar13 * auVar106._24_4_);
            bVar13 = SUB81(uVar73 >> 7,0);
            auVar118._28_4_ = (uint)bVar13 * auVar95._28_4_ | (uint)!bVar13 * auVar106._28_4_;
            bVar13 = (bool)((byte)uVar73 & 1);
            auVar119._0_4_ = (float)((uint)bVar13 * auVar96._0_4_ | (uint)!bVar13 * auVar94._0_4_);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar119._4_4_ = (float)((uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * auVar94._4_4_);
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar119._8_4_ = (float)((uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * auVar94._8_4_);
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar119._12_4_ =
                 (float)((uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * auVar94._12_4_);
            bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar119._16_4_ =
                 (float)((uint)bVar13 * auVar96._16_4_ | (uint)!bVar13 * auVar94._16_4_);
            bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar119._20_4_ =
                 (float)((uint)bVar13 * auVar96._20_4_ | (uint)!bVar13 * auVar94._20_4_);
            bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar119._24_4_ =
                 (float)((uint)bVar13 * auVar96._24_4_ | (uint)!bVar13 * auVar94._24_4_);
            bVar13 = SUB81(uVar73 >> 7,0);
            auVar119._28_4_ = (uint)bVar13 * auVar96._28_4_ | (uint)!bVar13 * auVar94._28_4_;
            vandps_avx512vl(auVar107,auVar102);
            vandps_avx512vl(auVar101,auVar102);
            auVar108 = vmaxps_avx(auVar119,auVar119);
            vandps_avx512vl(auVar109,auVar102);
            auVar108 = vmaxps_avx(auVar108,auVar119);
            uVar73 = vcmpps_avx512vl(auVar108,local_400,1);
            bVar13 = (bool)((byte)uVar73 & 1);
            auVar120._0_4_ = (uint)bVar13 * auVar95._0_4_ | (uint)!bVar13 * auVar107._0_4_;
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar120._4_4_ = (uint)bVar13 * auVar95._4_4_ | (uint)!bVar13 * auVar107._4_4_;
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar120._8_4_ = (uint)bVar13 * auVar95._8_4_ | (uint)!bVar13 * auVar107._8_4_;
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar120._12_4_ = (uint)bVar13 * auVar95._12_4_ | (uint)!bVar13 * auVar107._12_4_;
            bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar120._16_4_ = (uint)bVar13 * auVar95._16_4_ | (uint)!bVar13 * auVar107._16_4_;
            bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar120._20_4_ = (uint)bVar13 * auVar95._20_4_ | (uint)!bVar13 * auVar107._20_4_;
            bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar120._24_4_ = (uint)bVar13 * auVar95._24_4_ | (uint)!bVar13 * auVar107._24_4_;
            bVar13 = SUB81(uVar73 >> 7,0);
            auVar120._28_4_ = (uint)bVar13 * auVar95._28_4_ | (uint)!bVar13 * auVar107._28_4_;
            bVar13 = (bool)((byte)uVar73 & 1);
            auVar121._0_4_ = (float)((uint)bVar13 * auVar96._0_4_ | (uint)!bVar13 * auVar101._0_4_);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar121._4_4_ = (float)((uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * auVar101._4_4_);
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar121._8_4_ = (float)((uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * auVar101._8_4_);
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar121._12_4_ =
                 (float)((uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * auVar101._12_4_);
            bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar121._16_4_ =
                 (float)((uint)bVar13 * auVar96._16_4_ | (uint)!bVar13 * auVar101._16_4_);
            bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar121._20_4_ =
                 (float)((uint)bVar13 * auVar96._20_4_ | (uint)!bVar13 * auVar101._20_4_);
            bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar121._24_4_ =
                 (float)((uint)bVar13 * auVar96._24_4_ | (uint)!bVar13 * auVar101._24_4_);
            bVar13 = SUB81(uVar73 >> 7,0);
            auVar121._28_4_ = (uint)bVar13 * auVar96._28_4_ | (uint)!bVar13 * auVar101._28_4_;
            auVar202._8_4_ = 0x80000000;
            auVar202._0_8_ = 0x8000000080000000;
            auVar202._12_4_ = 0x80000000;
            auVar202._16_4_ = 0x80000000;
            auVar202._20_4_ = 0x80000000;
            auVar202._24_4_ = 0x80000000;
            auVar202._28_4_ = 0x80000000;
            auVar108 = vxorps_avx512vl(auVar120,auVar202);
            auVar101 = auVar214._0_32_;
            auVar109 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar101);
            auVar213 = vfmadd231ps_fma(auVar109,auVar119,auVar119);
            auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar213));
            auVar209._8_4_ = 0xbf000000;
            auVar209._0_8_ = 0xbf000000bf000000;
            auVar209._12_4_ = 0xbf000000;
            auVar209._16_4_ = 0xbf000000;
            auVar209._20_4_ = 0xbf000000;
            auVar209._24_4_ = 0xbf000000;
            auVar209._28_4_ = 0xbf000000;
            fVar163 = auVar109._0_4_;
            fVar175 = auVar109._4_4_;
            fVar182 = auVar109._8_4_;
            fVar183 = auVar109._12_4_;
            fVar184 = auVar109._16_4_;
            fVar174 = auVar109._20_4_;
            fVar82 = auVar109._24_4_;
            auVar46._4_4_ = fVar175 * fVar175 * fVar175 * auVar213._4_4_ * -0.5;
            auVar46._0_4_ = fVar163 * fVar163 * fVar163 * auVar213._0_4_ * -0.5;
            auVar46._8_4_ = fVar182 * fVar182 * fVar182 * auVar213._8_4_ * -0.5;
            auVar46._12_4_ = fVar183 * fVar183 * fVar183 * auVar213._12_4_ * -0.5;
            auVar46._16_4_ = fVar184 * fVar184 * fVar184 * -0.0;
            auVar46._20_4_ = fVar174 * fVar174 * fVar174 * -0.0;
            auVar46._24_4_ = fVar82 * fVar82 * fVar82 * -0.0;
            auVar46._28_4_ = auVar119._28_4_;
            auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar109 = vfmadd231ps_avx512vl(auVar46,auVar107,auVar109);
            auVar47._4_4_ = auVar119._4_4_ * auVar109._4_4_;
            auVar47._0_4_ = auVar119._0_4_ * auVar109._0_4_;
            auVar47._8_4_ = auVar119._8_4_ * auVar109._8_4_;
            auVar47._12_4_ = auVar119._12_4_ * auVar109._12_4_;
            auVar47._16_4_ = auVar119._16_4_ * auVar109._16_4_;
            auVar47._20_4_ = auVar119._20_4_ * auVar109._20_4_;
            auVar47._24_4_ = auVar119._24_4_ * auVar109._24_4_;
            auVar47._28_4_ = 0;
            auVar48._4_4_ = auVar109._4_4_ * -auVar118._4_4_;
            auVar48._0_4_ = auVar109._0_4_ * -auVar118._0_4_;
            auVar48._8_4_ = auVar109._8_4_ * -auVar118._8_4_;
            auVar48._12_4_ = auVar109._12_4_ * -auVar118._12_4_;
            auVar48._16_4_ = auVar109._16_4_ * -auVar118._16_4_;
            auVar48._20_4_ = auVar109._20_4_ * -auVar118._20_4_;
            auVar48._24_4_ = auVar109._24_4_ * -auVar118._24_4_;
            auVar48._28_4_ = auVar119._28_4_;
            auVar106 = vmulps_avx512vl(auVar109,auVar101);
            auVar109 = vfmadd213ps_avx512vl(auVar120,auVar120,auVar101);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar121,auVar121);
            auVar94 = vrsqrt14ps_avx512vl(auVar109);
            auVar109 = vmulps_avx512vl(auVar109,auVar209);
            fVar163 = auVar94._0_4_;
            fVar175 = auVar94._4_4_;
            fVar182 = auVar94._8_4_;
            fVar183 = auVar94._12_4_;
            fVar184 = auVar94._16_4_;
            fVar174 = auVar94._20_4_;
            fVar82 = auVar94._24_4_;
            auVar49._4_4_ = fVar175 * fVar175 * fVar175 * auVar109._4_4_;
            auVar49._0_4_ = fVar163 * fVar163 * fVar163 * auVar109._0_4_;
            auVar49._8_4_ = fVar182 * fVar182 * fVar182 * auVar109._8_4_;
            auVar49._12_4_ = fVar183 * fVar183 * fVar183 * auVar109._12_4_;
            auVar49._16_4_ = fVar184 * fVar184 * fVar184 * auVar109._16_4_;
            auVar49._20_4_ = fVar174 * fVar174 * fVar174 * auVar109._20_4_;
            auVar49._24_4_ = fVar82 * fVar82 * fVar82 * auVar109._24_4_;
            auVar49._28_4_ = auVar109._28_4_;
            auVar109 = vfmadd231ps_avx512vl(auVar49,auVar107,auVar94);
            auVar50._4_4_ = auVar121._4_4_ * auVar109._4_4_;
            auVar50._0_4_ = auVar121._0_4_ * auVar109._0_4_;
            auVar50._8_4_ = auVar121._8_4_ * auVar109._8_4_;
            auVar50._12_4_ = auVar121._12_4_ * auVar109._12_4_;
            auVar50._16_4_ = auVar121._16_4_ * auVar109._16_4_;
            auVar50._20_4_ = auVar121._20_4_ * auVar109._20_4_;
            auVar50._24_4_ = auVar121._24_4_ * auVar109._24_4_;
            auVar50._28_4_ = auVar94._28_4_;
            auVar51._4_4_ = auVar109._4_4_ * auVar108._4_4_;
            auVar51._0_4_ = auVar109._0_4_ * auVar108._0_4_;
            auVar51._8_4_ = auVar109._8_4_ * auVar108._8_4_;
            auVar51._12_4_ = auVar109._12_4_ * auVar108._12_4_;
            auVar51._16_4_ = auVar109._16_4_ * auVar108._16_4_;
            auVar51._20_4_ = auVar109._20_4_ * auVar108._20_4_;
            auVar51._24_4_ = auVar109._24_4_ * auVar108._24_4_;
            auVar51._28_4_ = auVar108._28_4_;
            auVar108 = vmulps_avx512vl(auVar109,auVar101);
            auVar213 = vfmadd213ps_fma(auVar47,ZEXT1632(auVar88),auVar97);
            auVar109 = ZEXT1632(auVar88);
            auVar20 = vfmadd213ps_fma(auVar48,auVar109,auVar98);
            auVar107 = vfmadd213ps_avx512vl(auVar106,auVar109,auVar93);
            auVar94 = vfmadd213ps_avx512vl(auVar50,ZEXT1632(auVar86),auVar99);
            auVar90 = vfnmadd213ps_fma(auVar47,auVar109,auVar97);
            auVar105 = ZEXT1632(auVar86);
            auVar89 = vfmadd213ps_fma(auVar51,auVar105,auVar100);
            auVar24 = vfnmadd213ps_fma(auVar48,auVar109,auVar98);
            auVar21 = vfmadd213ps_fma(auVar108,auVar105,auVar92);
            auVar98 = ZEXT1632(auVar88);
            auVar84 = vfnmadd231ps_fma(auVar93,auVar98,auVar106);
            auVar87 = vfnmadd213ps_fma(auVar50,auVar105,auVar99);
            auVar85 = vfnmadd213ps_fma(auVar51,auVar105,auVar100);
            auVar91 = vfnmadd231ps_fma(auVar92,ZEXT1632(auVar86),auVar108);
            auVar92 = vsubps_avx512vl(auVar94,ZEXT1632(auVar90));
            auVar108 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar24));
            auVar109 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar84));
            auVar52._4_4_ = auVar108._4_4_ * auVar84._4_4_;
            auVar52._0_4_ = auVar108._0_4_ * auVar84._0_4_;
            auVar52._8_4_ = auVar108._8_4_ * auVar84._8_4_;
            auVar52._12_4_ = auVar108._12_4_ * auVar84._12_4_;
            auVar52._16_4_ = auVar108._16_4_ * 0.0;
            auVar52._20_4_ = auVar108._20_4_ * 0.0;
            auVar52._24_4_ = auVar108._24_4_ * 0.0;
            auVar52._28_4_ = auVar106._28_4_;
            auVar88 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar24),auVar109);
            auVar53._4_4_ = auVar109._4_4_ * auVar90._4_4_;
            auVar53._0_4_ = auVar109._0_4_ * auVar90._0_4_;
            auVar53._8_4_ = auVar109._8_4_ * auVar90._8_4_;
            auVar53._12_4_ = auVar109._12_4_ * auVar90._12_4_;
            auVar53._16_4_ = auVar109._16_4_ * 0.0;
            auVar53._20_4_ = auVar109._20_4_ * 0.0;
            auVar53._24_4_ = auVar109._24_4_ * 0.0;
            auVar53._28_4_ = auVar109._28_4_;
            auVar22 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar84),auVar92);
            auVar54._4_4_ = auVar24._4_4_ * auVar92._4_4_;
            auVar54._0_4_ = auVar24._0_4_ * auVar92._0_4_;
            auVar54._8_4_ = auVar24._8_4_ * auVar92._8_4_;
            auVar54._12_4_ = auVar24._12_4_ * auVar92._12_4_;
            auVar54._16_4_ = auVar92._16_4_ * 0.0;
            auVar54._20_4_ = auVar92._20_4_ * 0.0;
            auVar54._24_4_ = auVar92._24_4_ * 0.0;
            auVar54._28_4_ = auVar92._28_4_;
            auVar23 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar90),auVar108);
            auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar101,ZEXT1632(auVar22));
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar101,ZEXT1632(auVar88));
            uVar73 = vcmpps_avx512vl(auVar108,auVar101,2);
            bVar81 = (byte)uVar73;
            fVar131 = (float)((uint)(bVar81 & 1) * auVar213._0_4_ |
                             (uint)!(bool)(bVar81 & 1) * auVar87._0_4_);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            fVar133 = (float)((uint)bVar13 * auVar213._4_4_ | (uint)!bVar13 * auVar87._4_4_);
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            fVar136 = (float)((uint)bVar13 * auVar213._8_4_ | (uint)!bVar13 * auVar87._8_4_);
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            fVar137 = (float)((uint)bVar13 * auVar213._12_4_ | (uint)!bVar13 * auVar87._12_4_);
            auVar105 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar136,CONCAT44(fVar133,fVar131))));
            fVar132 = (float)((uint)(bVar81 & 1) * auVar20._0_4_ |
                             (uint)!(bool)(bVar81 & 1) * auVar85._0_4_);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            fVar135 = (float)((uint)bVar13 * auVar20._4_4_ | (uint)!bVar13 * auVar85._4_4_);
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            fVar134 = (float)((uint)bVar13 * auVar20._8_4_ | (uint)!bVar13 * auVar85._8_4_);
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            fVar138 = (float)((uint)bVar13 * auVar20._12_4_ | (uint)!bVar13 * auVar85._12_4_);
            auVar95 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar134,CONCAT44(fVar135,fVar132))));
            auVar122._0_4_ =
                 (float)((uint)(bVar81 & 1) * auVar107._0_4_ |
                        (uint)!(bool)(bVar81 & 1) * auVar91._0_4_);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar122._4_4_ = (float)((uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar91._4_4_);
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar122._8_4_ = (float)((uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar91._8_4_);
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar122._12_4_ =
                 (float)((uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar91._12_4_);
            fVar163 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar107._16_4_);
            auVar122._16_4_ = fVar163;
            fVar175 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar107._20_4_);
            auVar122._20_4_ = fVar175;
            fVar182 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar107._24_4_);
            auVar122._24_4_ = fVar182;
            iVar1 = (uint)(byte)(uVar73 >> 7) * auVar107._28_4_;
            auVar122._28_4_ = iVar1;
            auVar108 = vblendmps_avx512vl(ZEXT1632(auVar90),auVar94);
            auVar123._0_4_ =
                 (uint)(bVar81 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar81 & 1) * auVar88._0_4_;
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar123._4_4_ = (uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar88._4_4_;
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar123._8_4_ = (uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar88._8_4_;
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar123._12_4_ = (uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar88._12_4_;
            auVar123._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar108._16_4_;
            auVar123._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar108._20_4_;
            auVar123._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar108._24_4_;
            auVar123._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar108._28_4_;
            auVar108 = vblendmps_avx512vl(ZEXT1632(auVar24),ZEXT1632(auVar89));
            auVar124._0_4_ =
                 (float)((uint)(bVar81 & 1) * auVar108._0_4_ |
                        (uint)!(bool)(bVar81 & 1) * auVar213._0_4_);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar213._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar213._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar213._12_4_);
            fVar184 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar108._16_4_);
            auVar124._16_4_ = fVar184;
            fVar174 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar108._20_4_);
            auVar124._20_4_ = fVar174;
            fVar183 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar108._24_4_);
            auVar124._24_4_ = fVar183;
            auVar124._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar108._28_4_;
            auVar108 = vblendmps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar21));
            auVar125._0_4_ =
                 (float)((uint)(bVar81 & 1) * auVar108._0_4_ |
                        (uint)!(bool)(bVar81 & 1) * auVar20._0_4_);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar125._4_4_ = (float)((uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar20._4_4_);
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar125._8_4_ = (float)((uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar20._8_4_);
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar125._12_4_ =
                 (float)((uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar20._12_4_);
            fVar130 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar108._16_4_);
            auVar125._16_4_ = fVar130;
            fVar83 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar108._20_4_);
            auVar125._20_4_ = fVar83;
            fVar82 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar108._24_4_);
            auVar125._24_4_ = fVar82;
            iVar2 = (uint)(byte)(uVar73 >> 7) * auVar108._28_4_;
            auVar125._28_4_ = iVar2;
            auVar126._0_4_ =
                 (uint)(bVar81 & 1) * (int)auVar90._0_4_ | (uint)!(bool)(bVar81 & 1) * auVar94._0_4_
            ;
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar126._4_4_ = (uint)bVar13 * (int)auVar90._4_4_ | (uint)!bVar13 * auVar94._4_4_;
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar126._8_4_ = (uint)bVar13 * (int)auVar90._8_4_ | (uint)!bVar13 * auVar94._8_4_;
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar126._12_4_ = (uint)bVar13 * (int)auVar90._12_4_ | (uint)!bVar13 * auVar94._12_4_;
            auVar126._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar94._16_4_;
            auVar126._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar94._20_4_;
            auVar126._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar94._24_4_;
            auVar126._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar94._28_4_;
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar73 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar73 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar94 = vsubps_avx512vl(auVar126,auVar105);
            auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar24._12_4_ |
                                                     (uint)!bVar17 * auVar89._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar24._8_4_ |
                                                              (uint)!bVar15 * auVar89._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar24._4_4_ |
                                                                       (uint)!bVar13 * auVar89._4_4_
                                                                       ,(uint)(bVar81 & 1) *
                                                                        (int)auVar24._0_4_ |
                                                                        (uint)!(bool)(bVar81 & 1) *
                                                                        auVar89._0_4_)))),auVar95);
            auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar84._12_4_ |
                                                     (uint)!bVar18 * auVar21._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar84._8_4_ |
                                                              (uint)!bVar16 * auVar21._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar84._4_4_ |
                                                                       (uint)!bVar14 * auVar21._4_4_
                                                                       ,(uint)(bVar81 & 1) *
                                                                        (int)auVar84._0_4_ |
                                                                        (uint)!(bool)(bVar81 & 1) *
                                                                        auVar21._0_4_)))),auVar122);
            auVar106 = vsubps_avx(auVar105,auVar123);
            auVar92 = vsubps_avx(auVar95,auVar124);
            auVar93 = vsubps_avx(auVar122,auVar125);
            auVar55._4_4_ = auVar107._4_4_ * fVar133;
            auVar55._0_4_ = auVar107._0_4_ * fVar131;
            auVar55._8_4_ = auVar107._8_4_ * fVar136;
            auVar55._12_4_ = auVar107._12_4_ * fVar137;
            auVar55._16_4_ = auVar107._16_4_ * 0.0;
            auVar55._20_4_ = auVar107._20_4_ * 0.0;
            auVar55._24_4_ = auVar107._24_4_ * 0.0;
            auVar55._28_4_ = 0;
            auVar88 = vfmsub231ps_fma(auVar55,auVar122,auVar94);
            auVar172._0_4_ = fVar132 * auVar94._0_4_;
            auVar172._4_4_ = fVar135 * auVar94._4_4_;
            auVar172._8_4_ = fVar134 * auVar94._8_4_;
            auVar172._12_4_ = fVar138 * auVar94._12_4_;
            auVar172._16_4_ = auVar94._16_4_ * 0.0;
            auVar172._20_4_ = auVar94._20_4_ * 0.0;
            auVar172._24_4_ = auVar94._24_4_ * 0.0;
            auVar172._28_4_ = 0;
            auVar213 = vfmsub231ps_fma(auVar172,auVar105,auVar109);
            auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar213),auVar101,ZEXT1632(auVar88));
            auVar180._0_4_ = auVar109._0_4_ * auVar122._0_4_;
            auVar180._4_4_ = auVar109._4_4_ * auVar122._4_4_;
            auVar180._8_4_ = auVar109._8_4_ * auVar122._8_4_;
            auVar180._12_4_ = auVar109._12_4_ * auVar122._12_4_;
            auVar180._16_4_ = auVar109._16_4_ * fVar163;
            auVar180._20_4_ = auVar109._20_4_ * fVar175;
            auVar180._24_4_ = auVar109._24_4_ * fVar182;
            auVar180._28_4_ = 0;
            auVar88 = vfmsub231ps_fma(auVar180,auVar95,auVar107);
            auVar96 = vfmadd231ps_avx512vl(auVar108,auVar101,ZEXT1632(auVar88));
            auVar108 = vmulps_avx512vl(auVar93,auVar123);
            auVar108 = vfmsub231ps_avx512vl(auVar108,auVar106,auVar125);
            auVar56._4_4_ = auVar92._4_4_ * auVar125._4_4_;
            auVar56._0_4_ = auVar92._0_4_ * auVar125._0_4_;
            auVar56._8_4_ = auVar92._8_4_ * auVar125._8_4_;
            auVar56._12_4_ = auVar92._12_4_ * auVar125._12_4_;
            auVar56._16_4_ = auVar92._16_4_ * fVar130;
            auVar56._20_4_ = auVar92._20_4_ * fVar83;
            auVar56._24_4_ = auVar92._24_4_ * fVar82;
            auVar56._28_4_ = iVar2;
            auVar88 = vfmsub231ps_fma(auVar56,auVar124,auVar93);
            auVar181._0_4_ = auVar124._0_4_ * auVar106._0_4_;
            auVar181._4_4_ = auVar124._4_4_ * auVar106._4_4_;
            auVar181._8_4_ = auVar124._8_4_ * auVar106._8_4_;
            auVar181._12_4_ = auVar124._12_4_ * auVar106._12_4_;
            auVar181._16_4_ = fVar184 * auVar106._16_4_;
            auVar181._20_4_ = fVar174 * auVar106._20_4_;
            auVar181._24_4_ = fVar183 * auVar106._24_4_;
            auVar181._28_4_ = 0;
            auVar213 = vfmsub231ps_fma(auVar181,auVar92,auVar123);
            auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar213),auVar101,auVar108);
            auVar97 = vfmadd231ps_avx512vl(auVar108,auVar101,ZEXT1632(auVar88));
            auVar108 = vmaxps_avx(auVar96,auVar97);
            uVar149 = vcmpps_avx512vl(auVar108,auVar101,2);
            local_2b0 = local_2b0 & (byte)uVar149;
            if (local_2b0 == 0) {
LAB_01b96569:
              local_2b0 = 0;
            }
            else {
              auVar57._4_4_ = auVar93._4_4_ * auVar109._4_4_;
              auVar57._0_4_ = auVar93._0_4_ * auVar109._0_4_;
              auVar57._8_4_ = auVar93._8_4_ * auVar109._8_4_;
              auVar57._12_4_ = auVar93._12_4_ * auVar109._12_4_;
              auVar57._16_4_ = auVar93._16_4_ * auVar109._16_4_;
              auVar57._20_4_ = auVar93._20_4_ * auVar109._20_4_;
              auVar57._24_4_ = auVar93._24_4_ * auVar109._24_4_;
              auVar57._28_4_ = auVar108._28_4_;
              auVar20 = vfmsub231ps_fma(auVar57,auVar92,auVar107);
              auVar58._4_4_ = auVar107._4_4_ * auVar106._4_4_;
              auVar58._0_4_ = auVar107._0_4_ * auVar106._0_4_;
              auVar58._8_4_ = auVar107._8_4_ * auVar106._8_4_;
              auVar58._12_4_ = auVar107._12_4_ * auVar106._12_4_;
              auVar58._16_4_ = auVar107._16_4_ * auVar106._16_4_;
              auVar58._20_4_ = auVar107._20_4_ * auVar106._20_4_;
              auVar58._24_4_ = auVar107._24_4_ * auVar106._24_4_;
              auVar58._28_4_ = auVar107._28_4_;
              auVar213 = vfmsub231ps_fma(auVar58,auVar94,auVar93);
              auVar59._4_4_ = auVar92._4_4_ * auVar94._4_4_;
              auVar59._0_4_ = auVar92._0_4_ * auVar94._0_4_;
              auVar59._8_4_ = auVar92._8_4_ * auVar94._8_4_;
              auVar59._12_4_ = auVar92._12_4_ * auVar94._12_4_;
              auVar59._16_4_ = auVar92._16_4_ * auVar94._16_4_;
              auVar59._20_4_ = auVar92._20_4_ * auVar94._20_4_;
              auVar59._24_4_ = auVar92._24_4_ * auVar94._24_4_;
              auVar59._28_4_ = auVar92._28_4_;
              auVar89 = vfmsub231ps_fma(auVar59,auVar106,auVar109);
              auVar88 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar213),ZEXT1632(auVar89));
              auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar20),auVar101);
              auVar109 = vrcp14ps_avx512vl(auVar108);
              auVar32._8_4_ = 0x3f800000;
              auVar32._0_8_ = &DAT_3f8000003f800000;
              auVar32._12_4_ = 0x3f800000;
              auVar32._16_4_ = 0x3f800000;
              auVar32._20_4_ = 0x3f800000;
              auVar32._24_4_ = 0x3f800000;
              auVar32._28_4_ = 0x3f800000;
              auVar107 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar32);
              auVar88 = vfmadd132ps_fma(auVar107,auVar109,auVar109);
              auVar60._4_4_ = auVar89._4_4_ * auVar122._4_4_;
              auVar60._0_4_ = auVar89._0_4_ * auVar122._0_4_;
              auVar60._8_4_ = auVar89._8_4_ * auVar122._8_4_;
              auVar60._12_4_ = auVar89._12_4_ * auVar122._12_4_;
              auVar60._16_4_ = fVar163 * 0.0;
              auVar60._20_4_ = fVar175 * 0.0;
              auVar60._24_4_ = fVar182 * 0.0;
              auVar60._28_4_ = iVar1;
              auVar213 = vfmadd231ps_fma(auVar60,auVar95,ZEXT1632(auVar213));
              auVar213 = vfmadd231ps_fma(ZEXT1632(auVar213),auVar105,ZEXT1632(auVar20));
              fVar175 = auVar88._0_4_;
              fVar182 = auVar88._4_4_;
              fVar183 = auVar88._8_4_;
              fVar184 = auVar88._12_4_;
              auVar109 = ZEXT1632(CONCAT412(auVar213._12_4_ * fVar184,
                                            CONCAT48(auVar213._8_4_ * fVar183,
                                                     CONCAT44(auVar213._4_4_ * fVar182,
                                                              auVar213._0_4_ * fVar175))));
              auVar69._4_4_ = uStack_39c;
              auVar69._0_4_ = local_3a0;
              auVar69._8_4_ = uStack_398;
              auVar69._12_4_ = uStack_394;
              auVar69._16_4_ = uStack_390;
              auVar69._20_4_ = uStack_38c;
              auVar69._24_4_ = uStack_388;
              auVar69._28_4_ = uStack_384;
              uVar149 = vcmpps_avx512vl(auVar109,auVar69,0xd);
              fVar163 = (ray->super_RayK<1>).tfar;
              auVar33._4_4_ = fVar163;
              auVar33._0_4_ = fVar163;
              auVar33._8_4_ = fVar163;
              auVar33._12_4_ = fVar163;
              auVar33._16_4_ = fVar163;
              auVar33._20_4_ = fVar163;
              auVar33._24_4_ = fVar163;
              auVar33._28_4_ = fVar163;
              uVar25 = vcmpps_avx512vl(auVar109,auVar33,2);
              local_2b0 = (byte)uVar149 & (byte)uVar25 & local_2b0;
              if (local_2b0 == 0) goto LAB_01b96569;
              uVar149 = vcmpps_avx512vl(auVar108,auVar101,4);
              if ((local_2b0 & (byte)uVar149) == 0) {
                local_2b0 = 0;
              }
              else {
                local_2b0 = local_2b0 & (byte)uVar149;
                fVar163 = auVar96._0_4_ * fVar175;
                fVar174 = auVar96._4_4_ * fVar182;
                auVar61._4_4_ = fVar174;
                auVar61._0_4_ = fVar163;
                fVar82 = auVar96._8_4_ * fVar183;
                auVar61._8_4_ = fVar82;
                fVar83 = auVar96._12_4_ * fVar184;
                auVar61._12_4_ = fVar83;
                fVar130 = auVar96._16_4_ * 0.0;
                auVar61._16_4_ = fVar130;
                fVar131 = auVar96._20_4_ * 0.0;
                auVar61._20_4_ = fVar131;
                fVar132 = auVar96._24_4_ * 0.0;
                auVar61._24_4_ = fVar132;
                auVar61._28_4_ = auVar96._28_4_;
                fVar175 = auVar97._0_4_ * fVar175;
                fVar182 = auVar97._4_4_ * fVar182;
                auVar62._4_4_ = fVar182;
                auVar62._0_4_ = fVar175;
                fVar183 = auVar97._8_4_ * fVar183;
                auVar62._8_4_ = fVar183;
                fVar184 = auVar97._12_4_ * fVar184;
                auVar62._12_4_ = fVar184;
                fVar133 = auVar97._16_4_ * 0.0;
                auVar62._16_4_ = fVar133;
                fVar135 = auVar97._20_4_ * 0.0;
                auVar62._20_4_ = fVar135;
                fVar136 = auVar97._24_4_ * 0.0;
                auVar62._24_4_ = fVar136;
                auVar62._28_4_ = auVar97._28_4_;
                auVar191._8_4_ = 0x3f800000;
                auVar191._0_8_ = &DAT_3f8000003f800000;
                auVar191._12_4_ = 0x3f800000;
                auVar191._16_4_ = 0x3f800000;
                auVar191._20_4_ = 0x3f800000;
                auVar191._24_4_ = 0x3f800000;
                auVar191._28_4_ = 0x3f800000;
                auVar108 = vsubps_avx512vl(auVar191,auVar61);
                bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar73 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar73 >> 6) & 1);
                bVar19 = SUB81(uVar73 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar19 * auVar96._28_4_ |
                                              (uint)!bVar19 * auVar108._28_4_,
                                              CONCAT424((uint)bVar18 * (int)fVar132 |
                                                        (uint)!bVar18 * auVar108._24_4_,
                                                        CONCAT420((uint)bVar17 * (int)fVar131 |
                                                                  (uint)!bVar17 * auVar108._20_4_,
                                                                  CONCAT416((uint)bVar16 *
                                                                            (int)fVar130 |
                                                                            (uint)!bVar16 *
                                                                            auVar108._16_4_,
                                                                            CONCAT412((uint)bVar15 *
                                                                                      (int)fVar83 |
                                                                                      (uint)!bVar15
                                                                                      * auVar108.
                                                  _12_4_,CONCAT48((uint)bVar14 * (int)fVar82 |
                                                                  (uint)!bVar14 * auVar108._8_4_,
                                                                  CONCAT44((uint)bVar13 *
                                                                           (int)fVar174 |
                                                                           (uint)!bVar13 *
                                                                           auVar108._4_4_,
                                                                           (uint)(bVar81 & 1) *
                                                                           (int)fVar163 |
                                                                           (uint)!(bool)(bVar81 & 1)
                                                                           * auVar108._0_4_))))))));
                auVar108 = vsubps_avx(auVar191,auVar62);
                bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar73 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar73 >> 6) & 1);
                bVar19 = SUB81(uVar73 >> 7,0);
                local_240._4_4_ = (uint)bVar13 * (int)fVar182 | (uint)!bVar13 * auVar108._4_4_;
                local_240._0_4_ =
                     (uint)(bVar81 & 1) * (int)fVar175 | (uint)!(bool)(bVar81 & 1) * auVar108._0_4_;
                local_240._8_4_ = (uint)bVar14 * (int)fVar183 | (uint)!bVar14 * auVar108._8_4_;
                local_240._12_4_ = (uint)bVar15 * (int)fVar184 | (uint)!bVar15 * auVar108._12_4_;
                local_240._16_4_ = (uint)bVar16 * (int)fVar133 | (uint)!bVar16 * auVar108._16_4_;
                local_240._20_4_ = (uint)bVar17 * (int)fVar135 | (uint)!bVar17 * auVar108._20_4_;
                local_240._24_4_ = (uint)bVar18 * (int)fVar136 | (uint)!bVar18 * auVar108._24_4_;
                local_240._28_4_ = (uint)bVar19 * auVar97._28_4_ | (uint)!bVar19 * auVar108._28_4_;
                in_ZMM21 = ZEXT3264(auVar109);
              }
            }
            auVar211 = ZEXT3264(local_500);
            auVar210 = ZEXT3264(local_4e0);
            auVar215 = ZEXT1664(local_600);
            auVar195 = ZEXT3264(local_580);
            auVar173 = ZEXT3264(local_5e0);
            if (local_2b0 != 0) {
              auVar108 = vsubps_avx(ZEXT1632(auVar86),auVar98);
              local_360 = in_ZMM20._0_32_;
              auVar108 = vfmadd213ps_avx512vl(auVar108,local_360,auVar98);
              auVar144._0_4_ = auVar108._0_4_ + auVar108._0_4_;
              auVar144._4_4_ = auVar108._4_4_ + auVar108._4_4_;
              auVar144._8_4_ = auVar108._8_4_ + auVar108._8_4_;
              auVar144._12_4_ = auVar108._12_4_ + auVar108._12_4_;
              auVar144._16_4_ = auVar108._16_4_ + auVar108._16_4_;
              auVar144._20_4_ = auVar108._20_4_ + auVar108._20_4_;
              auVar144._24_4_ = auVar108._24_4_ + auVar108._24_4_;
              auVar144._28_4_ = auVar108._28_4_ + auVar108._28_4_;
              fVar163 = pre->depth_scale;
              auVar34._4_4_ = fVar163;
              auVar34._0_4_ = fVar163;
              auVar34._8_4_ = fVar163;
              auVar34._12_4_ = fVar163;
              auVar34._16_4_ = fVar163;
              auVar34._20_4_ = fVar163;
              auVar34._24_4_ = fVar163;
              auVar34._28_4_ = fVar163;
              auVar108 = vmulps_avx512vl(auVar144,auVar34);
              local_320 = in_ZMM21._0_32_;
              uVar149 = vcmpps_avx512vl(local_320,auVar108,6);
              local_2b0 = local_2b0 & (byte)uVar149;
              uVar79 = (uint)local_2b0;
              if (local_2b0 != 0) {
                auVar145._8_4_ = 0xbf800000;
                auVar145._0_8_ = 0xbf800000bf800000;
                auVar145._12_4_ = 0xbf800000;
                auVar145._16_4_ = 0xbf800000;
                auVar145._20_4_ = 0xbf800000;
                auVar145._24_4_ = 0xbf800000;
                auVar145._28_4_ = 0xbf800000;
                auVar35._8_4_ = 0x40000000;
                auVar35._0_8_ = 0x4000000040000000;
                auVar35._12_4_ = 0x40000000;
                auVar35._16_4_ = 0x40000000;
                auVar35._20_4_ = 0x40000000;
                auVar35._24_4_ = 0x40000000;
                auVar35._28_4_ = 0x40000000;
                local_240 = vfmadd132ps_avx512vl(local_240,auVar145,auVar35);
                auVar108 = local_240;
                local_340 = local_240;
                local_300 = (int)lVar77;
                local_2fc = iVar10;
                local_2f0 = local_600;
                local_2e0 = local_550;
                uStack_2d8 = uStack_548;
                local_2d0 = local_560;
                uStack_2c8 = uStack_558;
                local_2c0 = CONCAT44(fStack_53c,local_540);
                uStack_2b8 = CONCAT44(fStack_534,fStack_538);
                local_4b0 = (context->scene->geometries).items[local_608].ptr;
                local_240 = auVar108;
                if ((local_4b0->mask & (ray->super_RayK<1>).mask) != 0) {
                  auVar109 = vaddps_avx512vl(local_360,_DAT_02020f40);
                  auVar88 = vcvtsi2ss_avx512f(auVar212._0_16_,(int)lVar77);
                  fVar163 = auVar88._0_4_;
                  local_2a0[0] = (fVar163 + auVar109._0_4_) * (float)local_380._0_4_;
                  local_2a0[1] = (fVar163 + auVar109._4_4_) * (float)local_380._4_4_;
                  local_2a0[2] = (fVar163 + auVar109._8_4_) * fStack_378;
                  local_2a0[3] = (fVar163 + auVar109._12_4_) * fStack_374;
                  fStack_290 = (fVar163 + auVar109._16_4_) * fStack_370;
                  fStack_28c = (fVar163 + auVar109._20_4_) * fStack_36c;
                  fStack_288 = (fVar163 + auVar109._24_4_) * fStack_368;
                  fStack_284 = fVar163 + auVar109._28_4_;
                  local_280 = local_240._0_8_;
                  uStack_278 = local_240._8_8_;
                  uStack_270 = local_240._16_8_;
                  uStack_268 = local_240._24_8_;
                  local_260 = local_320;
                  auVar146._8_4_ = 0x7f800000;
                  auVar146._0_8_ = 0x7f8000007f800000;
                  auVar146._12_4_ = 0x7f800000;
                  auVar146._16_4_ = 0x7f800000;
                  auVar146._20_4_ = 0x7f800000;
                  auVar146._24_4_ = 0x7f800000;
                  auVar146._28_4_ = 0x7f800000;
                  auVar109 = vblendmps_avx512vl(auVar146,local_320);
                  auVar127._0_4_ =
                       (uint)(local_2b0 & 1) * auVar109._0_4_ |
                       (uint)!(bool)(local_2b0 & 1) * 0x7f800000;
                  bVar13 = (bool)(local_2b0 >> 1 & 1);
                  auVar127._4_4_ = (uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_2b0 >> 2 & 1);
                  auVar127._8_4_ = (uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_2b0 >> 3 & 1);
                  auVar127._12_4_ = (uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_2b0 >> 4 & 1);
                  auVar127._16_4_ = (uint)bVar13 * auVar109._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_2b0 >> 5 & 1);
                  auVar127._20_4_ = (uint)bVar13 * auVar109._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_2b0 >> 6 & 1);
                  auVar127._24_4_ = (uint)bVar13 * auVar109._24_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar127._28_4_ =
                       (uint)(local_2b0 >> 7) * auVar109._28_4_ |
                       (uint)!(bool)(local_2b0 >> 7) * 0x7f800000;
                  auVar109 = vshufps_avx(auVar127,auVar127,0xb1);
                  auVar109 = vminps_avx(auVar127,auVar109);
                  auVar107 = vshufpd_avx(auVar109,auVar109,5);
                  auVar109 = vminps_avx(auVar109,auVar107);
                  auVar107 = vpermpd_avx2(auVar109,0x4e);
                  auVar109 = vminps_avx(auVar109,auVar107);
                  uVar149 = vcmpps_avx512vl(auVar127,auVar109,0);
                  bVar72 = (byte)uVar149 & local_2b0;
                  bVar81 = local_2b0;
                  if (bVar72 != 0) {
                    bVar81 = bVar72;
                  }
                  uVar76 = 0;
                  for (uVar75 = (uint)bVar81; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000)
                  {
                    uVar76 = uVar76 + 1;
                  }
                  uVar73 = (ulong)uVar76;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (local_4b0->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar163 = local_2a0[uVar73];
                    fVar175 = *(float *)((long)&local_280 + uVar73 * 4);
                    fVar183 = 1.0 - fVar163;
                    fVar182 = fVar183 * fVar183 * -3.0;
                    auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar183 * fVar183)),
                                              ZEXT416((uint)(fVar163 * fVar183)),ZEXT416(0xc0000000)
                                             );
                    auVar86 = vfmsub132ss_fma(ZEXT416((uint)(fVar163 * fVar183)),
                                              ZEXT416((uint)(fVar163 * fVar163)),ZEXT416(0x40000000)
                                             );
                    fVar183 = auVar88._0_4_ * 3.0;
                    fVar184 = auVar86._0_4_ * 3.0;
                    fVar174 = fVar163 * fVar163 * 3.0;
                    auVar187._0_4_ = fVar174 * local_540;
                    auVar187._4_4_ = fVar174 * fStack_53c;
                    auVar187._8_4_ = fVar174 * fStack_538;
                    auVar187._12_4_ = fVar174 * fStack_534;
                    auVar157._4_4_ = fVar184;
                    auVar157._0_4_ = fVar184;
                    auVar157._8_4_ = fVar184;
                    auVar157._12_4_ = fVar184;
                    auVar63._8_8_ = uStack_558;
                    auVar63._0_8_ = local_560;
                    auVar88 = vfmadd132ps_fma(auVar157,auVar187,auVar63);
                    auVar169._4_4_ = fVar183;
                    auVar169._0_4_ = fVar183;
                    auVar169._8_4_ = fVar183;
                    auVar169._12_4_ = fVar183;
                    auVar64._8_8_ = uStack_548;
                    auVar64._0_8_ = local_550;
                    auVar88 = vfmadd132ps_fma(auVar169,auVar88,auVar64);
                    auVar158._4_4_ = fVar182;
                    auVar158._0_4_ = fVar182;
                    auVar158._8_4_ = fVar182;
                    auVar158._12_4_ = fVar182;
                    (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar73 * 4);
                    auVar88 = vfmadd213ps_fma(auVar158,local_600,auVar88);
                    uVar149 = vmovlps_avx(auVar88);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar149;
                    fVar182 = (float)vextractps_avx(auVar88,2);
                    (ray->Ng).field_0.field_0.z = fVar182;
                    ray->u = fVar163;
                    ray->v = fVar175;
                    ray->primID = (uint)local_5e8;
                    ray->geomID = (uint)local_608;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                    auVar195 = ZEXT3264(local_580);
                    auVar173 = ZEXT3264(local_5e0);
                  }
                  else {
                    local_420 = (float)local_550;
                    fStack_41c = (float)((ulong)local_550 >> 0x20);
                    fStack_418 = (float)uStack_548;
                    fStack_414 = (float)((ulong)uStack_548 >> 0x20);
                    local_1e0 = local_560;
                    uStack_1d8 = uStack_558;
                    local_1f0 = CONCAT44(fStack_53c,local_540);
                    uStack_1e8 = CONCAT44(fStack_534,fStack_538);
                    local_440 = local_360;
                    local_460 = local_320;
                    local_610 = prim;
                    local_618 = context;
                    local_620 = pre;
                    do {
                      auVar213 = auVar214._0_16_;
                      local_524 = local_2a0[uVar73];
                      local_520 = *(undefined4 *)((long)&local_280 + uVar73 * 4);
                      local_410 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar73 * 4);
                      local_5b0.context = context->user;
                      fVar175 = 1.0 - local_524;
                      fVar163 = fVar175 * fVar175 * -3.0;
                      auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar175 * fVar175)),
                                                ZEXT416((uint)(local_524 * fVar175)),
                                                ZEXT416(0xc0000000));
                      auVar86 = vfmsub132ss_fma(ZEXT416((uint)(local_524 * fVar175)),
                                                ZEXT416((uint)(local_524 * local_524)),
                                                ZEXT416(0x40000000));
                      fVar175 = auVar88._0_4_ * 3.0;
                      fVar182 = auVar86._0_4_ * 3.0;
                      fVar183 = local_524 * local_524 * 3.0;
                      auVar188._0_4_ = fVar183 * (float)local_1f0;
                      auVar188._4_4_ = fVar183 * local_1f0._4_4_;
                      auVar188._8_4_ = fVar183 * (float)uStack_1e8;
                      auVar188._12_4_ = fVar183 * uStack_1e8._4_4_;
                      auVar159._4_4_ = fVar182;
                      auVar159._0_4_ = fVar182;
                      auVar159._8_4_ = fVar182;
                      auVar159._12_4_ = fVar182;
                      auVar70._8_8_ = uStack_1d8;
                      auVar70._0_8_ = local_1e0;
                      auVar88 = vfmadd132ps_fma(auVar159,auVar188,auVar70);
                      auVar170._4_4_ = fVar175;
                      auVar170._0_4_ = fVar175;
                      auVar170._8_4_ = fVar175;
                      auVar170._12_4_ = fVar175;
                      auVar67._4_4_ = fStack_41c;
                      auVar67._0_4_ = local_420;
                      auVar67._8_4_ = fStack_418;
                      auVar67._12_4_ = fStack_414;
                      auVar88 = vfmadd132ps_fma(auVar170,auVar88,auVar67);
                      auVar160._4_4_ = fVar163;
                      auVar160._0_4_ = fVar163;
                      auVar160._8_4_ = fVar163;
                      auVar160._12_4_ = fVar163;
                      auVar88 = vfmadd213ps_fma(auVar160,auVar215._0_16_,auVar88);
                      local_530 = vmovlps_avx(auVar88);
                      local_528 = vextractps_avx(auVar88,2);
                      local_51c = (int)local_5e8;
                      local_518 = (int)local_608;
                      local_514 = (local_5b0.context)->instID[0];
                      local_510 = (local_5b0.context)->instPrimID[0];
                      local_624 = -1;
                      local_5b0.valid = &local_624;
                      local_5b0.geometryUserPtr = local_4b0->userPtr;
                      local_5b0.ray = (RTCRayN *)ray;
                      local_5b0.hit = (RTCHitN *)&local_530;
                      local_5b0.N = 1;
                      if (local_4b0->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b967f2:
                        auVar88 = auVar214._0_16_;
                        p_Var12 = context->args->filter;
                        if (p_Var12 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((local_4b0->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var12)(&local_5b0);
                            auVar217 = ZEXT3264(local_4a0);
                            auVar216 = ZEXT3264(local_480);
                            auVar211 = ZEXT3264(local_500);
                            auVar210 = ZEXT3264(local_4e0);
                            auVar212 = ZEXT3264(local_3c0);
                            auVar215 = ZEXT1664(local_600);
                            in_ZMM21 = ZEXT3264(local_460);
                            in_ZMM20 = ZEXT3264(local_440);
                            auVar88 = vxorps_avx512vl(auVar88,auVar88);
                            auVar214 = ZEXT1664(auVar88);
                            prim = local_610;
                            context = local_618;
                            pre = local_620;
                          }
                          if (*local_5b0.valid == 0) goto LAB_01b968ee;
                        }
                        (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).components[0] =
                             *(float *)local_5b0.hit;
                        (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_5b0.hit + 4);
                        (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_5b0.hit + 8);
                        *(float *)((long)local_5b0.ray + 0x3c) = *(float *)(local_5b0.hit + 0xc);
                        *(float *)((long)local_5b0.ray + 0x40) = *(float *)(local_5b0.hit + 0x10);
                        *(float *)((long)local_5b0.ray + 0x44) = *(float *)(local_5b0.hit + 0x14);
                        *(float *)((long)local_5b0.ray + 0x48) = *(float *)(local_5b0.hit + 0x18);
                        *(float *)((long)local_5b0.ray + 0x4c) = *(float *)(local_5b0.hit + 0x1c);
                        *(float *)((long)local_5b0.ray + 0x50) = *(float *)(local_5b0.hit + 0x20);
                      }
                      else {
                        (*local_4b0->intersectionFilterN)(&local_5b0);
                        auVar217 = ZEXT3264(local_4a0);
                        auVar216 = ZEXT3264(local_480);
                        auVar211 = ZEXT3264(local_500);
                        auVar210 = ZEXT3264(local_4e0);
                        auVar212 = ZEXT3264(local_3c0);
                        auVar215 = ZEXT1664(local_600);
                        in_ZMM21 = ZEXT3264(local_460);
                        in_ZMM20 = ZEXT3264(local_440);
                        auVar88 = vxorps_avx512vl(auVar213,auVar213);
                        auVar214 = ZEXT1664(auVar88);
                        prim = local_610;
                        context = local_618;
                        pre = local_620;
                        if (*local_5b0.valid != 0) goto LAB_01b967f2;
LAB_01b968ee:
                        (ray->super_RayK<1>).tfar = local_410;
                      }
                      bVar72 = ~(byte)(1 << ((uint)uVar73 & 0x1f)) & (byte)uVar79;
                      fVar163 = (ray->super_RayK<1>).tfar;
                      auVar36._4_4_ = fVar163;
                      auVar36._0_4_ = fVar163;
                      auVar36._8_4_ = fVar163;
                      auVar36._12_4_ = fVar163;
                      auVar36._16_4_ = fVar163;
                      auVar36._20_4_ = fVar163;
                      auVar36._24_4_ = fVar163;
                      auVar36._28_4_ = fVar163;
                      uVar149 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar36,2);
                      bVar81 = bVar72 & (byte)uVar149;
                      uVar79 = (uint)bVar81;
                      auVar195 = ZEXT3264(local_580);
                      auVar173 = ZEXT3264(local_5e0);
                      if ((bVar72 & (byte)uVar149) != 0) {
                        auVar147._8_4_ = 0x7f800000;
                        auVar147._0_8_ = 0x7f8000007f800000;
                        auVar147._12_4_ = 0x7f800000;
                        auVar147._16_4_ = 0x7f800000;
                        auVar147._20_4_ = 0x7f800000;
                        auVar147._24_4_ = 0x7f800000;
                        auVar147._28_4_ = 0x7f800000;
                        auVar108 = vblendmps_avx512vl(auVar147,in_ZMM21._0_32_);
                        auVar128._0_4_ =
                             (uint)(bVar81 & 1) * auVar108._0_4_ |
                             (uint)!(bool)(bVar81 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 1 & 1);
                        auVar128._4_4_ = (uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 2 & 1);
                        auVar128._8_4_ = (uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 3 & 1);
                        auVar128._12_4_ =
                             (uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 4 & 1);
                        auVar128._16_4_ =
                             (uint)bVar13 * auVar108._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 5 & 1);
                        auVar128._20_4_ =
                             (uint)bVar13 * auVar108._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 6 & 1);
                        auVar128._24_4_ =
                             (uint)bVar13 * auVar108._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar128._28_4_ =
                             (uint)(bVar81 >> 7) * auVar108._28_4_ |
                             (uint)!(bool)(bVar81 >> 7) * 0x7f800000;
                        auVar108 = vshufps_avx(auVar128,auVar128,0xb1);
                        auVar108 = vminps_avx(auVar128,auVar108);
                        auVar109 = vshufpd_avx(auVar108,auVar108,5);
                        auVar108 = vminps_avx(auVar108,auVar109);
                        auVar109 = vpermpd_avx2(auVar108,0x4e);
                        auVar108 = vminps_avx(auVar108,auVar109);
                        uVar149 = vcmpps_avx512vl(auVar128,auVar108,0);
                        bVar72 = (byte)uVar149 & bVar81;
                        uVar76 = uVar79;
                        if (bVar72 != 0) {
                          uVar76 = (uint)bVar72;
                        }
                        uVar75 = 0;
                        for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
                          uVar75 = uVar75 + 1;
                        }
                        uVar73 = (ulong)uVar75;
                      }
                    } while (bVar81 != 0);
                  }
                }
              }
            }
          }
          lVar77 = lVar77 + 8;
        } while ((int)lVar77 < iVar10);
      }
      fVar163 = (ray->super_RayK<1>).tfar;
      auVar28._4_4_ = fVar163;
      auVar28._0_4_ = fVar163;
      auVar28._8_4_ = fVar163;
      auVar28._12_4_ = fVar163;
      uVar149 = vcmpps_avx512vl(local_1d0,auVar28,2);
      uVar79 = (uint)uVar80 & (uint)uVar149;
      uVar80 = (ulong)uVar79;
    } while (uVar79 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }